

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2019.h
# Opt level: O0

void __thiscall Spaghetti<UFPC>::PerformLabeling(Spaghetti<UFPC> *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  uchar *puVar7;
  uint *puVar8;
  int iVar9;
  int iLabel_3;
  int iLabel_2;
  int c_5;
  uint *img_labels_row_5;
  uchar *img_row_5;
  int iLabel_1;
  int iLabel;
  int c_4;
  uint *img_labels_row_fol;
  uint *img_labels_row_4;
  uchar *img_row_fol_2;
  uchar *img_row_4;
  int r;
  int c_3;
  uint *img_labels_row_prev_prev_1;
  uint *img_labels_row_3;
  uchar *img_row_prev_prev_1;
  uchar *img_row_prev_1;
  uchar *img_row_3;
  int r_2;
  int c_2;
  uint *img_labels_row_prev_prev;
  uint *img_labels_row_2;
  uchar *img_row_fol_1;
  uchar *img_row_prev_prev;
  uchar *img_row_prev;
  uchar *img_row_2;
  int r_1;
  int c_1;
  uint *img_labels_row_1;
  uchar *img_row_fol;
  uchar *img_row_1;
  int c;
  uint *img_labels_row;
  uchar *img_row;
  Size local_90;
  Mat_<int> local_88;
  byte local_25;
  uint local_24;
  bool o_cols;
  int e_cols;
  uint uStack_18;
  bool o_rows;
  int e_rows;
  int w;
  int h;
  Spaghetti<UFPC> *this_local;
  
  e_rows = *(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  uStack_18 = *(uint *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc;
  e_cols = e_rows & 0xfffffffe;
  o_cols = e_rows % 2 == 1;
  local_24 = uStack_18 & 0xfffffffe;
  local_25 = (int)uStack_18 % 2 == 1;
  _w = this;
  cv::MatSize::operator()((MatSize *)&local_90);
  cv::Mat_<int>::Mat_(&local_88,&local_90);
  cv::Mat_<int>::operator=((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_,&local_88)
  ;
  cv::Mat_<int>::~Mat_(&local_88);
  UFPC::Alloc(((*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8 + 1) /
              2) * ((*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0xc +
                    1) / 2) + 1);
  UFPC::Setup();
  if (e_rows == 1) {
    puVar7 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,0);
    puVar8 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                        ,0);
    img_row_1._4_4_ = -2;
LAB_0015e0eb:
    iVar5 = img_row_1._4_4_ + 2;
    if (iVar5 < (int)(uStack_18 - 2)) {
      if (puVar7[iVar5] == '\0') goto LAB_0015e1aa;
      if (puVar7[img_row_1._4_4_ + 3] == '\0') {
        uVar6 = UFPC::NewLabel();
        puVar8[iVar5] = uVar6;
        img_row_1._4_4_ = iVar5;
      }
      else {
        uVar6 = UFPC::NewLabel();
        puVar8[iVar5] = uVar6;
        img_row_1._4_4_ = iVar5;
        while( true ) {
          while( true ) {
            iVar5 = img_row_1._4_4_ + 2;
            if ((int)(uStack_18 - 2) <= iVar5) {
              if ((int)(uStack_18 - 2) < iVar5) {
                if (puVar7[iVar5] == '\0') {
                  puVar8[iVar5] = 0;
                }
                else {
                  puVar8[iVar5] = puVar8[img_row_1._4_4_];
                }
              }
              else {
                if (puVar7[iVar5] == '\0') goto LAB_0015e3cb;
                if (puVar7[img_row_1._4_4_ + 3] == '\0') {
                  puVar8[iVar5] = puVar8[img_row_1._4_4_];
                }
                else {
                  puVar8[iVar5] = puVar8[img_row_1._4_4_];
                }
              }
              goto LAB_00165e4f;
            }
            if (puVar7[iVar5] == '\0') break;
            if (puVar7[img_row_1._4_4_ + 3] == '\0') {
              puVar8[iVar5] = puVar8[img_row_1._4_4_];
              img_row_1._4_4_ = iVar5;
              goto LAB_0015e0eb;
            }
            puVar8[iVar5] = puVar8[img_row_1._4_4_];
            img_row_1._4_4_ = iVar5;
          }
LAB_0015e1aa:
          img_row_1._4_4_ = iVar5;
          if (puVar7[img_row_1._4_4_ + 1] == '\0') break;
          uVar6 = UFPC::NewLabel();
          puVar8[img_row_1._4_4_] = uVar6;
        }
        puVar8[img_row_1._4_4_] = 0;
      }
      goto LAB_0015e0eb;
    }
    if ((int)(uStack_18 - 2) < iVar5) {
      if (puVar7[iVar5] == '\0') {
        puVar8[iVar5] = 0;
      }
      else {
        uVar6 = UFPC::NewLabel();
        puVar8[iVar5] = uVar6;
      }
    }
    else if (puVar7[iVar5] == '\0') {
LAB_0015e3cb:
      img_row_1._4_4_ = iVar5;
      if (puVar7[img_row_1._4_4_ + 1] == '\0') {
        puVar8[img_row_1._4_4_] = 0;
      }
      else {
        uVar6 = UFPC::NewLabel();
        puVar8[img_row_1._4_4_] = uVar6;
      }
    }
    else if (puVar7[img_row_1._4_4_ + 3] == '\0') {
      uVar6 = UFPC::NewLabel();
      puVar8[iVar5] = uVar6;
    }
    else {
      uVar6 = UFPC::NewLabel();
      puVar8[iVar5] = uVar6;
    }
  }
  else {
    puVar7 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,0);
    lVar1 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
    puVar8 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                        ,0);
    img_row_2._4_4_ = -2;
LAB_0015e506:
    img_row_2._4_4_ = img_row_2._4_4_ + 2;
    iVar5 = img_row_2._4_4_;
    if (img_row_2._4_4_ < (int)(uStack_18 - 2)) {
      if ((puVar7[img_row_2._4_4_] == '\0') && (puVar7[img_row_2._4_4_ + lVar1] == '\0'))
      goto LAB_0015e5c3;
LAB_0015e552:
      if (puVar7[img_row_2._4_4_ + 1] == '\0') {
        uVar6 = UFPC::NewLabel();
        puVar8[img_row_2._4_4_] = uVar6;
        goto LAB_0015e727;
      }
      uVar6 = UFPC::NewLabel();
      puVar8[img_row_2._4_4_] = uVar6;
LAB_0015e649:
      do {
        iVar5 = img_row_2._4_4_ + 2;
        if ((int)(uStack_18 - 2) <= iVar5) {
          if ((int)(uStack_18 - 2) < iVar5) {
            if (puVar7[iVar5] == '\0') {
              if (puVar7[iVar5 + lVar1] == '\0') {
                puVar8[iVar5] = 0;
              }
              else {
                puVar8[iVar5] = puVar8[img_row_2._4_4_];
              }
            }
            else {
              puVar8[iVar5] = puVar8[img_row_2._4_4_];
            }
          }
          else {
            img_row_2._4_4_ = iVar5;
            if ((puVar7[iVar5] == '\0') && (puVar7[iVar5 + lVar1] == '\0')) goto LAB_0015eaeb;
LAB_0015eb90:
            if (puVar7[img_row_2._4_4_ + 1] == '\0') {
              puVar8[img_row_2._4_4_] = puVar8[img_row_2._4_4_ + -2];
            }
            else {
              puVar8[img_row_2._4_4_] = puVar8[img_row_2._4_4_ + -2];
            }
          }
          goto LAB_0015eca0;
        }
        img_row_2._4_4_ = iVar5;
        if ((puVar7[iVar5] == '\0') && (puVar7[iVar5 + lVar1] == '\0')) {
LAB_0015e5c3:
          img_row_2._4_4_ = iVar5;
          if (puVar7[img_row_2._4_4_ + 1] == '\0') {
            if (puVar7[(img_row_2._4_4_ + 1) + lVar1] == '\0') {
              puVar8[img_row_2._4_4_] = 0;
              goto LAB_0015e506;
            }
            uVar6 = UFPC::NewLabel();
            puVar8[img_row_2._4_4_] = uVar6;
          }
          else {
            uVar6 = UFPC::NewLabel();
            puVar8[img_row_2._4_4_] = uVar6;
          }
        }
        else {
          while (puVar7[img_row_2._4_4_ + 1] == '\0') {
            puVar8[img_row_2._4_4_] = puVar8[img_row_2._4_4_ + -2];
LAB_0015e727:
            while( true ) {
              iVar5 = img_row_2._4_4_ + 2;
              if ((int)(uStack_18 - 2) <= iVar5) {
                if ((int)(uStack_18 - 2) < iVar5) {
                  if ((puVar7[iVar5] == '\0') && (puVar7[iVar5 + lVar1] == '\0')) {
                    puVar8[iVar5] = 0;
                    goto LAB_0015eca0;
                  }
                }
                else {
                  if (puVar7[iVar5] != '\0') {
                    iVar9 = img_row_2._4_4_ + 1;
                    img_row_2._4_4_ = iVar5;
                    if (puVar7[iVar9 + lVar1] != '\0') goto LAB_0015eb90;
                    goto LAB_0015ea7d;
                  }
                  if (puVar7[iVar5 + lVar1] == '\0') goto LAB_0015eaeb;
                }
                if (puVar7[(img_row_2._4_4_ + 1) + lVar1] == '\0') {
                  uVar6 = UFPC::NewLabel();
                  puVar8[iVar5] = uVar6;
                }
                else {
                  puVar8[iVar5] = puVar8[img_row_2._4_4_];
                }
                goto LAB_0015eca0;
              }
              if (puVar7[iVar5] != '\0') break;
              if (puVar7[iVar5 + lVar1] == '\0') goto LAB_0015e5c3;
              if (puVar7[img_row_2._4_4_ + 3] != '\0') {
                if (puVar7[(img_row_2._4_4_ + 1) + lVar1] == '\0') {
                  uVar6 = UFPC::NewLabel();
                  puVar8[iVar5] = uVar6;
                  img_row_2._4_4_ = iVar5;
                }
                else {
                  puVar8[iVar5] = puVar8[img_row_2._4_4_];
                  img_row_2._4_4_ = iVar5;
                }
                goto LAB_0015e649;
              }
              if (puVar7[(img_row_2._4_4_ + 1) + lVar1] == '\0') {
                uVar6 = UFPC::NewLabel();
                puVar8[iVar5] = uVar6;
                img_row_2._4_4_ = iVar5;
              }
              else {
                puVar8[iVar5] = puVar8[img_row_2._4_4_];
                img_row_2._4_4_ = iVar5;
              }
            }
            iVar9 = img_row_2._4_4_ + 1;
            img_row_2._4_4_ = iVar5;
            if (puVar7[iVar9 + lVar1] == '\0') goto LAB_0015e552;
          }
          puVar8[img_row_2._4_4_] = puVar8[img_row_2._4_4_ + -2];
        }
      } while( true );
    }
    if ((int)(uStack_18 - 2) < img_row_2._4_4_) {
      if (puVar7[img_row_2._4_4_] == '\0') {
        if (puVar7[img_row_2._4_4_ + lVar1] == '\0') {
          puVar8[img_row_2._4_4_] = 0;
        }
        else {
          uVar6 = UFPC::NewLabel();
          puVar8[img_row_2._4_4_] = uVar6;
        }
      }
      else {
        uVar6 = UFPC::NewLabel();
        puVar8[img_row_2._4_4_] = uVar6;
      }
    }
    else if ((puVar7[img_row_2._4_4_] == '\0') && (puVar7[img_row_2._4_4_ + lVar1] == '\0')) {
LAB_0015eaeb:
      img_row_2._4_4_ = iVar5;
      if (puVar7[img_row_2._4_4_ + 1] == '\0') {
        if (puVar7[(img_row_2._4_4_ + 1) + lVar1] == '\0') {
          puVar8[img_row_2._4_4_] = 0;
        }
        else {
          uVar6 = UFPC::NewLabel();
          puVar8[img_row_2._4_4_] = uVar6;
        }
      }
      else {
        uVar6 = UFPC::NewLabel();
        puVar8[img_row_2._4_4_] = uVar6;
      }
    }
    else {
LAB_0015ea7d:
      if (puVar7[img_row_2._4_4_ + 1] == '\0') {
        uVar6 = UFPC::NewLabel();
        puVar8[img_row_2._4_4_] = uVar6;
      }
      else {
        uVar6 = UFPC::NewLabel();
        puVar8[img_row_2._4_4_] = uVar6;
      }
    }
LAB_0015eca0:
    for (img_row_2._0_4_ = 2; (int)img_row_2 < e_cols; img_row_2._0_4_ = (int)img_row_2 + 2) {
      puVar7 = cv::Mat::ptr<unsigned_char>
                         (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                          (int)img_row_2);
      lVar1 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
      lVar3 = -**(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48 -
              lVar1;
      lVar2 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
      puVar8 = cv::Mat::ptr<unsigned_int>
                         (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                           super_Mat,(int)img_row_2);
      lVar4 = -**(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                           field_0x48 -
              **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                          field_0x48;
      iVar5 = 0;
      img_row_3._4_4_ = 0;
      if (0 < (int)(uStack_18 - 2)) {
        if (*puVar7 == '\0') goto LAB_0015efec;
LAB_0015edda:
        img_row_3._4_4_ = iVar5;
        if (puVar7[(img_row_3._4_4_ + 1) - lVar1] == '\0') {
          if (puVar7[img_row_3._4_4_ + 1] != '\0') goto LAB_0015ee3f;
          if (puVar7[img_row_3._4_4_ - lVar1] != '\0') {
            puVar8[img_row_3._4_4_] = *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
            goto LAB_001613f8;
          }
          uVar6 = UFPC::NewLabel();
          puVar8[img_row_3._4_4_] = uVar6;
          goto LAB_001612fa;
        }
        puVar8[img_row_3._4_4_] = *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
LAB_00161976:
        do {
          iVar5 = img_row_3._4_4_ + 2;
          if ((int)(uStack_18 - 2) <= iVar5) {
            if ((int)(uStack_18 - 2) < iVar5) {
              if (puVar7[iVar5] == '\0') {
                if (puVar7[iVar5 + lVar2] == '\0') {
                  puVar8[iVar5] = 0;
                }
                else {
LAB_001628e2:
                  if (puVar7[(img_row_3._4_4_ + 1) + lVar2] == '\0') {
                    if (puVar7[img_row_3._4_4_ + 1] == '\0') {
                      uVar6 = UFPC::NewLabel();
                      puVar8[iVar5] = uVar6;
                    }
                    else {
                      puVar8[iVar5] = puVar8[img_row_3._4_4_];
                    }
                  }
                  else {
                    puVar8[iVar5] = puVar8[img_row_3._4_4_];
                  }
                }
              }
              else if (puVar7[img_row_3._4_4_ + 1] == '\0') {
                if (puVar7[(img_row_3._4_4_ + 1) + lVar2] == '\0') {
LAB_0016285a:
                  if (puVar7[iVar5 - lVar1] == '\0') {
                    puVar8[iVar5] = *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
                  }
                  else {
                    puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4);
                  }
                }
                else {
                  puVar8[iVar5] = puVar8[img_row_3._4_4_];
                }
              }
              else {
                puVar8[iVar5] = puVar8[img_row_3._4_4_];
              }
              goto LAB_00163b14;
            }
            if (puVar7[iVar5] == '\0') {
              if (puVar7[iVar5 + lVar2] == '\0') goto LAB_00162b4f;
              if (puVar7[img_row_3._4_4_ + 3] == '\0') goto LAB_001628e2;
              if (puVar7[img_row_3._4_4_ + 1] != '\0') goto LAB_001633ab;
              if (puVar7[(img_row_3._4_4_ + 1) + lVar2] == '\0') goto LAB_00162aaf;
              if (puVar7[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
                if (puVar7[iVar5 - lVar1] == '\0') {
                  puVar8[iVar5] = puVar8[img_row_3._4_4_];
                }
                else {
                  puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4);
                }
                goto LAB_00163b14;
              }
            }
            else {
              if ((puVar7[img_row_3._4_4_ + 1] == '\0') &&
                 (puVar7[(img_row_3._4_4_ + 1) + lVar2] == '\0')) {
                if (puVar7[(img_row_3._4_4_ + 3) - lVar1] == '\0') goto LAB_0016285a;
                img_row_3._4_4_ = iVar5;
                if (puVar7[iVar5 - lVar1] == '\0') {
LAB_00162c61:
                  if (puVar7[img_row_3._4_4_ + lVar3] == '\0') {
                    uVar6 = UFPC::Merge(*(uint *)((long)puVar8 +
                                                 (long)(img_row_3._4_4_ + -2) * 4 + lVar4),
                                        *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4))
                    ;
                    puVar8[img_row_3._4_4_] = uVar6;
                  }
                  else {
                    puVar8[img_row_3._4_4_] =
                         *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
                  }
                }
                else {
                  puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4);
                }
                goto LAB_00163b14;
              }
LAB_001633ab:
              img_row_3._4_4_ = iVar5;
              iVar5 = img_row_3._4_4_;
              if (puVar7[(img_row_3._4_4_ + 1) - lVar1] == '\0') {
                puVar8[img_row_3._4_4_] = puVar8[img_row_3._4_4_ + -2];
                goto LAB_00163b14;
              }
            }
LAB_001633cd:
            img_row_3._4_4_ = iVar5;
            if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
              if (puVar7[img_row_3._4_4_ + lVar3] == '\0') {
                uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4),
                                    puVar8[img_row_3._4_4_ + -2]);
                puVar8[img_row_3._4_4_] = uVar6;
              }
              else {
                puVar8[img_row_3._4_4_] =
                     *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
              }
            }
            else {
              puVar8[img_row_3._4_4_] = *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
            }
            goto LAB_00163b14;
          }
          if (puVar7[iVar5] == '\0') {
            if (puVar7[iVar5 + lVar2] == '\0') goto LAB_0015f08c;
            if (puVar7[img_row_3._4_4_ + 3] == '\0') {
              if (puVar7[(img_row_3._4_4_ + 1) + lVar2] != '\0') {
                puVar8[iVar5] = puVar8[img_row_3._4_4_];
                img_row_3._4_4_ = iVar5;
                goto LAB_00160d73;
              }
              if (puVar7[img_row_3._4_4_ + 1] != '\0') {
                puVar8[iVar5] = puVar8[img_row_3._4_4_];
                img_row_3._4_4_ = iVar5;
                goto LAB_00160d73;
              }
              uVar6 = UFPC::NewLabel();
              puVar8[iVar5] = uVar6;
              img_row_3._4_4_ = iVar5;
              goto LAB_00160d73;
            }
            if (puVar7[img_row_3._4_4_ + 1] != '\0') goto LAB_00160c5e;
            if (puVar7[(img_row_3._4_4_ + 1) + lVar2] == '\0') goto LAB_0015f025;
            if (puVar7[(img_row_3._4_4_ + 3) - lVar1] != '\0') goto LAB_00160c80;
            if (puVar7[(img_row_3._4_4_ + 4) - lVar1] != '\0') goto LAB_00160a8f;
            if (puVar7[iVar5 - lVar1] != '\0') {
              puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4);
              img_row_3._4_4_ = iVar5;
              goto LAB_0016013c;
            }
            puVar8[iVar5] = puVar8[img_row_3._4_4_];
            img_row_3._4_4_ = iVar5;
LAB_0015fe18:
            do {
              iVar5 = img_row_3._4_4_ + 2;
              if ((int)(uStack_18 - 2) <= iVar5) {
                if ((int)(uStack_18 - 2) < iVar5) {
LAB_0016253c:
                  img_row_3._4_4_ = iVar5;
                  if (puVar7[img_row_3._4_4_] == '\0') {
LAB_001624e0:
                    if (puVar7[img_row_3._4_4_ + lVar2] == '\0') {
                      puVar8[img_row_3._4_4_] = 0;
                    }
                    else {
                      puVar8[img_row_3._4_4_] = puVar8[img_row_3._4_4_ + -2];
                    }
                  }
                  else {
                    puVar8[img_row_3._4_4_] = puVar8[img_row_3._4_4_ + -2];
                  }
                  goto LAB_00163b14;
                }
                if (puVar7[iVar5] == '\0') {
                  if (puVar7[iVar5 + lVar2] == '\0') {
LAB_001630aa:
                    img_row_3._4_4_ = iVar5;
                    if (puVar7[img_row_3._4_4_ + 1] == '\0') goto LAB_00162b72;
                    if (puVar7[(img_row_3._4_4_ + 1) - lVar1] == '\0') {
                      uVar6 = UFPC::NewLabel();
                      puVar8[img_row_3._4_4_] = uVar6;
                    }
                    else {
                      puVar8[img_row_3._4_4_] =
                           *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
                    }
                    goto LAB_00163b14;
                  }
                  if (puVar7[img_row_3._4_4_ + 3] == '\0') {
                    puVar8[iVar5] = puVar8[img_row_3._4_4_];
                    goto LAB_00163b14;
                  }
                }
                if (puVar7[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
                  puVar8[iVar5] = puVar8[img_row_3._4_4_];
                }
                else {
                  uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4),
                                      puVar8[img_row_3._4_4_]);
                  puVar8[iVar5] = uVar6;
                }
                goto LAB_00163b14;
              }
              if (puVar7[iVar5] != '\0') {
                if (puVar7[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
                  if (puVar7[img_row_3._4_4_ + 3] == '\0') {
                    puVar8[iVar5] = puVar8[img_row_3._4_4_];
                    img_row_3._4_4_ = iVar5;
                    goto LAB_00161d75;
                  }
LAB_0015fee8:
                  if (puVar7[(img_row_3._4_4_ + 4) - lVar1] != '\0') {
                    uVar6 = UFPC::Merge(*(uint *)((long)puVar8 +
                                                 (long)(img_row_3._4_4_ + 4) * 4 + lVar4),
                                        puVar8[img_row_3._4_4_]);
                    puVar8[iVar5] = uVar6;
                    img_row_3._4_4_ = iVar5;
                    goto LAB_00160605;
                  }
                  puVar8[iVar5] = puVar8[img_row_3._4_4_];
                  img_row_3._4_4_ = iVar5;
                  goto LAB_00160eae;
                }
                uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4),
                                    puVar8[img_row_3._4_4_]);
                puVar8[iVar5] = uVar6;
                img_row_3._4_4_ = iVar5;
                goto LAB_00161976;
              }
              if (puVar7[iVar5 + lVar2] != '\0') {
                if (puVar7[img_row_3._4_4_ + 3] == '\0') {
                  puVar8[iVar5] = puVar8[img_row_3._4_4_];
                  img_row_3._4_4_ = iVar5;
                  goto LAB_00160d73;
                }
                if (puVar7[(img_row_3._4_4_ + 3) - lVar1] != '\0') {
                  uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4),
                                      puVar8[img_row_3._4_4_]);
                  puVar8[iVar5] = uVar6;
                  img_row_3._4_4_ = iVar5;
                  goto LAB_00160919;
                }
                goto LAB_0015fee8;
              }
LAB_0016006f:
              img_row_3._4_4_ = iVar5;
              iVar5 = img_row_3._4_4_;
              if (puVar7[img_row_3._4_4_ + 1] == '\0') goto LAB_0015f0af;
              if (puVar7[(img_row_3._4_4_ + 1) - lVar1] != '\0') {
                puVar8[img_row_3._4_4_] =
                     *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
                goto LAB_00160919;
              }
              if (puVar7[(img_row_3._4_4_ + 2) - lVar1] != '\0') {
                puVar8[img_row_3._4_4_] =
                     *(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 2) * 4 + lVar4);
LAB_00160605:
                iVar5 = img_row_3._4_4_ + 2;
                if ((int)(uStack_18 - 2) <= iVar5) {
                  if ((int)(uStack_18 - 2) < iVar5) goto LAB_0016253c;
                  if (puVar7[iVar5] == '\0') {
                    if (puVar7[iVar5 + lVar2] == '\0') {
                      iVar9 = img_row_3._4_4_ + 3;
                      img_row_3._4_4_ = iVar5;
                      if (puVar7[iVar9] == '\0') goto LAB_00162b72;
                      puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4);
                      goto LAB_00163b14;
                    }
                    if (puVar7[img_row_3._4_4_ + 3] == '\0') {
                      puVar8[iVar5] = puVar8[img_row_3._4_4_];
                      goto LAB_00163b14;
                    }
                  }
                  if (puVar7[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
                    puVar8[iVar5] = puVar8[img_row_3._4_4_];
                  }
                  else {
                    puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4);
                  }
                  goto LAB_00163b14;
                }
                if (puVar7[iVar5] == '\0') {
                  if (puVar7[iVar5 + lVar2] == '\0') {
                    if (puVar7[img_row_3._4_4_ + 3] == '\0') goto LAB_0015f0af;
                    if (puVar7[(img_row_3._4_4_ + 3) - lVar1] != '\0') {
                      puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4);
                      img_row_3._4_4_ = iVar5;
                      goto LAB_00160919;
                    }
                    iVar9 = img_row_3._4_4_ + 4;
                    img_row_3._4_4_ = iVar5;
                    if (puVar7[iVar9 - lVar1] == '\0') {
                      puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4);
                      goto LAB_0016013c;
                    }
LAB_0015ee7c:
                    if (puVar7[(img_row_3._4_4_ + 1) + lVar3] == '\0') {
                      uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4
                                                   ),
                                          *(uint *)((long)puVar8 +
                                                   (long)(img_row_3._4_4_ + 2) * 4 + lVar4));
                      puVar8[img_row_3._4_4_] = uVar6;
                    }
                    else {
                      puVar8[img_row_3._4_4_] =
                           *(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 2) * 4 + lVar4);
                    }
                    goto LAB_00160605;
                  }
                  if (puVar7[img_row_3._4_4_ + 3] == '\0') {
                    puVar8[iVar5] = puVar8[img_row_3._4_4_];
                    img_row_3._4_4_ = iVar5;
                    goto LAB_00160d73;
                  }
                  if (puVar7[(img_row_3._4_4_ + 3) - lVar1] != '\0') {
                    puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4);
                    img_row_3._4_4_ = iVar5;
                    goto LAB_00160919;
                  }
                }
                else {
                  if (puVar7[(img_row_3._4_4_ + 3) - lVar1] != '\0') {
                    puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4);
                    img_row_3._4_4_ = iVar5;
                    goto LAB_00161976;
                  }
                  if (puVar7[img_row_3._4_4_ + 3] == '\0') {
                    puVar8[iVar5] = puVar8[img_row_3._4_4_];
                    img_row_3._4_4_ = iVar5;
                    goto LAB_00161d75;
                  }
                }
                if (puVar7[(img_row_3._4_4_ + 4) - lVar1] == '\0') {
                  puVar8[iVar5] = puVar8[img_row_3._4_4_];
                  img_row_3._4_4_ = iVar5;
LAB_00160eae:
                  do {
                    iVar5 = img_row_3._4_4_ + 2;
                    if ((int)(uStack_18 - 2) <= iVar5) {
                      if ((int)(uStack_18 - 2) < iVar5) goto LAB_0016253c;
                      if (puVar7[iVar5] == '\0') {
                        if (puVar7[iVar5 + lVar2] == '\0') goto LAB_001630aa;
                        if (puVar7[img_row_3._4_4_ + 3] == '\0') {
                          puVar8[iVar5] = puVar8[img_row_3._4_4_];
                          goto LAB_00163b14;
                        }
                      }
                      if (puVar7[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
                        puVar8[iVar5] = puVar8[img_row_3._4_4_];
                      }
                      else if (puVar7[iVar5 + lVar3] == '\0') {
                        uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4),
                                            puVar8[img_row_3._4_4_]);
                        puVar8[iVar5] = uVar6;
                      }
                      else {
LAB_001629fa:
                        img_row_3._4_4_ = iVar5;
                        iVar5 = img_row_3._4_4_;
                        if (puVar7[(img_row_3._4_4_ + -2) - lVar1] == '\0') {
                          uVar6 = UFPC::Merge(*(uint *)((long)puVar8 +
                                                       (long)img_row_3._4_4_ * 4 + lVar4),
                                              puVar8[img_row_3._4_4_ + -2]);
                          puVar8[img_row_3._4_4_] = uVar6;
                        }
                        else {
LAB_001626f5:
                          img_row_3._4_4_ = iVar5;
                          if (puVar7[(img_row_3._4_4_ + -1) + lVar3] == '\0') {
                            uVar6 = UFPC::Merge(*(uint *)((long)puVar8 +
                                                         (long)img_row_3._4_4_ * 4 + lVar4),
                                                puVar8[img_row_3._4_4_ + -2]);
                            puVar8[img_row_3._4_4_] = uVar6;
                          }
                          else {
                            puVar8[img_row_3._4_4_] =
                                 *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
                          }
                        }
                      }
                      goto LAB_00163b14;
                    }
                    if (puVar7[iVar5] == '\0') {
                      if (puVar7[iVar5 + lVar2] == '\0') goto LAB_0016006f;
                      if (puVar7[img_row_3._4_4_ + 3] == '\0') {
                        puVar8[iVar5] = puVar8[img_row_3._4_4_];
                        img_row_3._4_4_ = iVar5;
                        goto LAB_00160d73;
                      }
                      if (puVar7[(img_row_3._4_4_ + 3) - lVar1] != '\0') {
                        if (puVar7[iVar5 + lVar3] == '\0') {
                          uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4),
                                              puVar8[img_row_3._4_4_]);
                          puVar8[iVar5] = uVar6;
                          img_row_3._4_4_ = iVar5;
                        }
                        else {
                          if (puVar7[img_row_3._4_4_ - lVar1] != '\0') goto LAB_00160504;
                          uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4),
                                              puVar8[img_row_3._4_4_]);
                          puVar8[iVar5] = uVar6;
                          img_row_3._4_4_ = iVar5;
                        }
LAB_00160919:
                        do {
                          iVar5 = img_row_3._4_4_ + 2;
                          if ((int)(uStack_18 - 2) <= iVar5) {
                            if ((int)(uStack_18 - 2) < iVar5) goto LAB_0016253c;
                            if (puVar7[iVar5] != '\0') goto LAB_001633ab;
                            if (puVar7[iVar5 + lVar2] == '\0') goto LAB_00162b4f;
                            if (puVar7[img_row_3._4_4_ + 3] != '\0') goto LAB_001633ab;
                            puVar8[iVar5] = puVar8[img_row_3._4_4_];
                            goto LAB_00163b14;
                          }
                          if (puVar7[iVar5] != '\0') goto LAB_00160969;
                          if (puVar7[iVar5 + lVar2] == '\0') goto LAB_0015f08c;
                          if (puVar7[img_row_3._4_4_ + 3] == '\0') {
                            puVar8[iVar5] = puVar8[img_row_3._4_4_];
                            img_row_3._4_4_ = iVar5;
LAB_00160d73:
                            iVar5 = img_row_3._4_4_ + 2;
                            if (iVar5 < (int)(uStack_18 - 2)) {
                              if (puVar7[iVar5] != '\0') {
                                iVar9 = img_row_3._4_4_ + 1;
                                img_row_3._4_4_ = iVar5;
                                if (puVar7[iVar9 + lVar2] == '\0') goto LAB_0015f14d;
                                goto LAB_0015f5b0;
                              }
LAB_00160de5:
                              img_row_3._4_4_ = iVar5;
                              iVar5 = img_row_3._4_4_;
                              if (puVar7[img_row_3._4_4_ + lVar2] == '\0') goto LAB_0015f08c;
                              if (puVar7[img_row_3._4_4_ + 1] != '\0') {
                                if (puVar7[(img_row_3._4_4_ + -1) + lVar2] == '\0')
                                goto LAB_0015f025;
LAB_0015fc3a:
                                img_row_3._4_4_ = iVar5;
                                if (puVar7[(img_row_3._4_4_ + 1) - lVar1] == '\0') {
LAB_0015fc9c:
                                  if (puVar7[(img_row_3._4_4_ + 2) - lVar1] == '\0') {
LAB_0015fa88:
                                    if (puVar7[img_row_3._4_4_ - lVar1] != '\0') {
                                      uVar6 = UFPC::Merge(*(uint *)((long)puVar8 +
                                                                   (long)img_row_3._4_4_ * 4 + lVar4
                                                                   ),puVar8[img_row_3._4_4_ + -2]);
                                      puVar8[img_row_3._4_4_] = uVar6;
LAB_0016013c:
                                      iVar5 = img_row_3._4_4_ + 2;
                                      if (iVar5 < (int)(uStack_18 - 2)) {
                                        if (puVar7[iVar5] != '\0') {
                                          if (puVar7[(img_row_3._4_4_ + 3) - lVar1] == '\0')
                                          goto LAB_00160292;
                                          if (puVar7[iVar5 + lVar3] != '\0') goto LAB_001601c7;
                                          uVar6 = UFPC::Merge(*(uint *)((long)puVar8 +
                                                                       (long)iVar5 * 4 + lVar4),
                                                              puVar8[img_row_3._4_4_]);
                                          puVar8[iVar5] = uVar6;
                                          img_row_3._4_4_ = iVar5;
                                          goto LAB_00161976;
                                        }
                                        if (puVar7[iVar5 + lVar2] == '\0') goto LAB_0016006f;
                                        if (puVar7[img_row_3._4_4_ + 3] == '\0') {
                                          puVar8[iVar5] = puVar8[img_row_3._4_4_];
                                          img_row_3._4_4_ = iVar5;
                                          goto LAB_00160d73;
                                        }
                                        if (puVar7[(img_row_3._4_4_ + 3) - lVar1] == '\0')
                                        goto LAB_001602b4;
                                        if (puVar7[iVar5 + lVar3] == '\0') {
                                          uVar6 = UFPC::Merge(*(uint *)((long)puVar8 +
                                                                       (long)iVar5 * 4 + lVar4),
                                                              puVar8[img_row_3._4_4_]);
                                          puVar8[iVar5] = uVar6;
                                          img_row_3._4_4_ = iVar5;
                                        }
                                        else {
LAB_00160504:
                                          img_row_3._4_4_ = iVar5;
                                          if (puVar7[(img_row_3._4_4_ + -1) + lVar3] == '\0') {
                                            uVar6 = UFPC::Merge(*(uint *)((long)puVar8 +
                                                                         (long)img_row_3._4_4_ * 4 +
                                                                         lVar4),
                                                                puVar8[img_row_3._4_4_ + -2]);
                                            puVar8[img_row_3._4_4_] = uVar6;
                                          }
                                          else {
                                            puVar8[img_row_3._4_4_] =
                                                 *(uint *)((long)puVar8 +
                                                          (long)img_row_3._4_4_ * 4 + lVar4);
                                          }
                                        }
                                        goto LAB_00160919;
                                      }
                                      if ((int)(uStack_18 - 2) < iVar5) goto LAB_0016253c;
                                      if (puVar7[iVar5] == '\0') {
                                        if (puVar7[iVar5 + lVar2] == '\0') goto LAB_001630aa;
                                        if (puVar7[img_row_3._4_4_ + 3] == '\0') {
                                          puVar8[iVar5] = puVar8[img_row_3._4_4_];
                                          goto LAB_00163b14;
                                        }
                                      }
                                      if (puVar7[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
                                        puVar8[iVar5] = puVar8[img_row_3._4_4_];
                                      }
                                      else {
                                        if (puVar7[iVar5 + lVar3] != '\0') goto LAB_001626f5;
                                        uVar6 = UFPC::Merge(*(uint *)((long)puVar8 +
                                                                     (long)iVar5 * 4 + lVar4),
                                                            puVar8[img_row_3._4_4_]);
                                        puVar8[iVar5] = uVar6;
                                      }
                                      goto LAB_00163b14;
                                    }
                                    puVar8[img_row_3._4_4_] = puVar8[img_row_3._4_4_ + -2];
                                    goto LAB_0015fe18;
                                  }
                                  if (puVar7[(img_row_3._4_4_ + 1) + lVar3] == '\0') {
                                    if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
                                      uVar6 = UFPC::Merge(*(uint *)((long)puVar8 +
                                                                   (long)(img_row_3._4_4_ + 2) * 4 +
                                                                   lVar4),
                                                          puVar8[img_row_3._4_4_ + -2]);
                                      puVar8[img_row_3._4_4_] = uVar6;
                                    }
                                    else {
                                      uVar6 = UFPC::Merge(*(uint *)((long)puVar8 +
                                                                   (long)img_row_3._4_4_ * 4 + lVar4
                                                                   ),
                                                          *(uint *)((long)puVar8 +
                                                                   (long)(img_row_3._4_4_ + 2) * 4 +
                                                                   lVar4));
                                      uVar6 = UFPC::Merge(uVar6,puVar8[img_row_3._4_4_ + -2]);
                                      puVar8[img_row_3._4_4_] = uVar6;
                                    }
                                  }
                                  else {
                                    uVar6 = UFPC::Merge(*(uint *)((long)puVar8 +
                                                                 (long)(img_row_3._4_4_ + 2) * 4 +
                                                                 lVar4),puVar8[img_row_3._4_4_ + -2]
                                                       );
                                    puVar8[img_row_3._4_4_] = uVar6;
                                  }
                                  goto LAB_00160605;
                                }
                                uVar6 = UFPC::Merge(*(uint *)((long)puVar8 +
                                                             (long)img_row_3._4_4_ * 4 + lVar4),
                                                    puVar8[img_row_3._4_4_ + -2]);
                                puVar8[img_row_3._4_4_] = uVar6;
                                goto LAB_00160919;
                              }
LAB_00160e44:
                              img_row_3._4_4_ = iVar5;
                              if (puVar7[(img_row_3._4_4_ + -1) + lVar2] == '\0') {
                                uVar6 = UFPC::NewLabel();
                                puVar8[img_row_3._4_4_] = uVar6;
                              }
                              else {
                                puVar8[img_row_3._4_4_] = puVar8[img_row_3._4_4_ + -2];
                              }
                              goto LAB_00160d73;
                            }
                            if ((int)(uStack_18 - 2) < iVar5) {
                              if (puVar7[iVar5] == '\0') {
LAB_001625c5:
                                img_row_3._4_4_ = iVar5;
                                iVar5 = img_row_3._4_4_;
                                if (puVar7[img_row_3._4_4_ + lVar2] == '\0') {
                                  puVar8[img_row_3._4_4_] = 0;
                                }
                                else {
LAB_001625de:
                                  img_row_3._4_4_ = iVar5;
                                  if (puVar7[(img_row_3._4_4_ + -1) + lVar2] == '\0') {
                                    uVar6 = UFPC::NewLabel();
                                    puVar8[img_row_3._4_4_] = uVar6;
                                  }
                                  else {
                                    puVar8[img_row_3._4_4_] = puVar8[img_row_3._4_4_ + -2];
                                  }
                                }
                                goto LAB_00163b14;
                              }
                              iVar9 = img_row_3._4_4_ + 1;
                              img_row_3._4_4_ = iVar5;
                              if (puVar7[iVar9 + lVar2] == '\0') goto LAB_00162331;
LAB_001623f4:
                              if (puVar7[(img_row_3._4_4_ + -1) - lVar1] != '\0') {
                                uVar6 = UFPC::Merge(*(uint *)((long)puVar8 +
                                                             (long)(img_row_3._4_4_ + -2) * 4 +
                                                             lVar4),puVar8[img_row_3._4_4_ + -2]);
                                puVar8[img_row_3._4_4_] = uVar6;
                                goto LAB_00163b14;
                              }
                            }
                            else {
                              if (puVar7[iVar5] != '\0') {
                                iVar9 = img_row_3._4_4_ + 1;
                                img_row_3._4_4_ = iVar5;
                                if (puVar7[iVar9 + lVar2] == '\0') {
LAB_00162be5:
                                  if (puVar7[(img_row_3._4_4_ + 1) - lVar1] == '\0') {
LAB_00162331:
                                    if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
                                      if (puVar7[(img_row_3._4_4_ + -1) - lVar1] == '\0') {
                                        uVar6 = UFPC::NewLabel();
                                        puVar8[img_row_3._4_4_] = uVar6;
                                      }
                                      else {
                                        puVar8[img_row_3._4_4_] =
                                             *(uint *)((long)puVar8 +
                                                      (long)(img_row_3._4_4_ + -2) * 4 + lVar4);
                                      }
                                    }
                                    else {
                                      puVar8[img_row_3._4_4_] =
                                           *(uint *)((long)puVar8 +
                                                    (long)img_row_3._4_4_ * 4 + lVar4);
                                    }
                                    goto LAB_00163b14;
                                  }
                                  if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
                                    if (puVar7[(img_row_3._4_4_ + -1) - lVar1] != '\0')
                                    goto LAB_00162c61;
                                    puVar8[img_row_3._4_4_] =
                                         *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4)
                                    ;
                                  }
                                  else {
                                    puVar8[img_row_3._4_4_] =
                                         *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4)
                                    ;
                                  }
                                }
                                else {
LAB_00162d31:
                                  img_row_3._4_4_ = iVar5;
                                  if (puVar7[(img_row_3._4_4_ + 1) - lVar1] == '\0')
                                  goto LAB_001623f4;
                                  if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
                                    if (puVar7[(img_row_3._4_4_ + -1) - lVar1] == '\0') {
                                      uVar6 = UFPC::Merge(*(uint *)((long)puVar8 +
                                                                   (long)img_row_3._4_4_ * 4 + lVar4
                                                                   ),puVar8[img_row_3._4_4_ + -2]);
                                      puVar8[img_row_3._4_4_] = uVar6;
                                    }
                                    else if (puVar7[img_row_3._4_4_ + lVar3] == '\0') {
                                      uVar6 = UFPC::Merge(*(uint *)((long)puVar8 +
                                                                   (long)(img_row_3._4_4_ + -2) * 4
                                                                   + lVar4),
                                                          *(uint *)((long)puVar8 +
                                                                   (long)img_row_3._4_4_ * 4 + lVar4
                                                                   ));
                                      uVar6 = UFPC::Merge(uVar6,puVar8[img_row_3._4_4_ + -2]);
                                      puVar8[img_row_3._4_4_] = uVar6;
                                    }
                                    else {
                                      uVar6 = UFPC::Merge(*(uint *)((long)puVar8 +
                                                                   (long)img_row_3._4_4_ * 4 + lVar4
                                                                   ),puVar8[img_row_3._4_4_ + -2]);
                                      puVar8[img_row_3._4_4_] = uVar6;
                                    }
                                  }
                                  else {
                                    uVar6 = UFPC::Merge(*(uint *)((long)puVar8 +
                                                                 (long)img_row_3._4_4_ * 4 + lVar4),
                                                        puVar8[img_row_3._4_4_ + -2]);
                                    puVar8[img_row_3._4_4_] = uVar6;
                                  }
                                }
                                goto LAB_00163b14;
                              }
LAB_0016355b:
                              img_row_3._4_4_ = iVar5;
                              iVar5 = img_row_3._4_4_;
                              if (puVar7[img_row_3._4_4_ + lVar2] == '\0') goto LAB_00162b4f;
                              if (puVar7[img_row_3._4_4_ + 1] == '\0') goto LAB_001625de;
LAB_00163590:
                              iVar5 = img_row_3._4_4_;
                              if (puVar7[(img_row_3._4_4_ + -1) + lVar2] == '\0') goto LAB_00162aaf;
LAB_00162f08:
                              img_row_3._4_4_ = iVar5;
                              if (puVar7[(img_row_3._4_4_ + 1) - lVar1] != '\0') {
                                uVar6 = UFPC::Merge(*(uint *)((long)puVar8 +
                                                             (long)img_row_3._4_4_ * 4 + lVar4),
                                                    puVar8[img_row_3._4_4_ + -2]);
                                puVar8[img_row_3._4_4_] = uVar6;
                                goto LAB_00163b14;
                              }
                            }
LAB_0016245b:
                            if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
                              puVar8[img_row_3._4_4_] = puVar8[img_row_3._4_4_ + -2];
                            }
                            else {
                              uVar6 = UFPC::Merge(*(uint *)((long)puVar8 +
                                                           (long)img_row_3._4_4_ * 4 + lVar4),
                                                  puVar8[img_row_3._4_4_ + -2]);
                              puVar8[img_row_3._4_4_] = uVar6;
                            }
                            goto LAB_00163b14;
                          }
LAB_00160c5e:
                          img_row_3._4_4_ = iVar5;
                          iVar5 = img_row_3._4_4_;
                          if (puVar7[(img_row_3._4_4_ + 1) - lVar1] == '\0') goto LAB_00160a6d;
LAB_00160c80:
                          img_row_3._4_4_ = iVar5;
                          if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
                            if (puVar7[img_row_3._4_4_ + lVar3] == '\0') {
                              uVar6 = UFPC::Merge(*(uint *)((long)puVar8 +
                                                           (long)img_row_3._4_4_ * 4 + lVar4),
                                                  puVar8[img_row_3._4_4_ + -2]);
                              puVar8[img_row_3._4_4_] = uVar6;
                            }
                            else {
                              puVar8[img_row_3._4_4_] =
                                   *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
                            }
                          }
                          else {
                            puVar8[img_row_3._4_4_] =
                                 *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
                          }
                        } while( true );
                      }
                    }
                    else {
                      if (puVar7[(img_row_3._4_4_ + 3) - lVar1] != '\0') {
                        if (puVar7[iVar5 + lVar3] == '\0') {
                          uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4),
                                              puVar8[img_row_3._4_4_]);
                          puVar8[iVar5] = uVar6;
                          img_row_3._4_4_ = iVar5;
                        }
                        else if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
                          uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4),
                                              puVar8[img_row_3._4_4_]);
                          puVar8[iVar5] = uVar6;
                          img_row_3._4_4_ = iVar5;
                        }
                        else {
LAB_001601c7:
                          img_row_3._4_4_ = iVar5;
                          if (puVar7[(img_row_3._4_4_ + -1) + lVar3] == '\0') {
                            uVar6 = UFPC::Merge(*(uint *)((long)puVar8 +
                                                         (long)img_row_3._4_4_ * 4 + lVar4),
                                                puVar8[img_row_3._4_4_ + -2]);
                            puVar8[img_row_3._4_4_] = uVar6;
                          }
                          else {
                            puVar8[img_row_3._4_4_] =
                                 *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
                          }
                        }
                        goto LAB_00161976;
                      }
                      if (puVar7[img_row_3._4_4_ + 3] == '\0') {
                        puVar8[iVar5] = puVar8[img_row_3._4_4_];
                        img_row_3._4_4_ = iVar5;
                        goto LAB_00161d75;
                      }
                    }
                    if (puVar7[(img_row_3._4_4_ + 4) - lVar1] != '\0') {
                      if (puVar7[(img_row_3._4_4_ + 3) + lVar3] == '\0') {
                        uVar6 = UFPC::Merge(*(uint *)((long)puVar8 +
                                                     (long)(img_row_3._4_4_ + 4) * 4 + lVar4),
                                            puVar8[img_row_3._4_4_]);
                        puVar8[iVar5] = uVar6;
                        img_row_3._4_4_ = iVar5;
                      }
                      else if (puVar7[iVar5 + lVar3] == '\0') {
                        uVar6 = UFPC::Merge(*(uint *)((long)puVar8 +
                                                     (long)(img_row_3._4_4_ + 4) * 4 + lVar4),
                                            puVar8[img_row_3._4_4_]);
                        puVar8[iVar5] = uVar6;
                        img_row_3._4_4_ = iVar5;
                      }
                      else if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
                        uVar6 = UFPC::Merge(*(uint *)((long)puVar8 +
                                                     (long)(img_row_3._4_4_ + 4) * 4 + lVar4),
                                            puVar8[img_row_3._4_4_]);
                        puVar8[iVar5] = uVar6;
                        img_row_3._4_4_ = iVar5;
                      }
                      else {
LAB_00160311:
                        img_row_3._4_4_ = iVar5;
                        if (puVar7[(img_row_3._4_4_ + -1) + lVar3] == '\0') {
                          uVar6 = UFPC::Merge(*(uint *)((long)puVar8 +
                                                       (long)(img_row_3._4_4_ + 2) * 4 + lVar4),
                                              puVar8[img_row_3._4_4_ + -2]);
                          puVar8[img_row_3._4_4_] = uVar6;
                        }
                        else {
                          puVar8[img_row_3._4_4_] =
                               *(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 2) * 4 + lVar4);
                        }
                      }
                      goto LAB_00160605;
                    }
                    puVar8[iVar5] = puVar8[img_row_3._4_4_];
                    img_row_3._4_4_ = iVar5;
                  } while( true );
                }
                if (puVar7[(img_row_3._4_4_ + 3) + lVar3] == '\0') {
                  uVar6 = UFPC::Merge(*(uint *)((long)puVar8 +
                                               (long)(img_row_3._4_4_ + 4) * 4 + lVar4),
                                      puVar8[img_row_3._4_4_]);
                  puVar8[iVar5] = uVar6;
                  img_row_3._4_4_ = iVar5;
                }
                else {
                  puVar8[iVar5] = *(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 4) * 4 + lVar4);
                  img_row_3._4_4_ = iVar5;
                }
                goto LAB_00160605;
              }
              uVar6 = UFPC::NewLabel();
              puVar8[img_row_3._4_4_] = uVar6;
            } while( true );
          }
          if (puVar7[img_row_3._4_4_ + 1] != '\0') goto LAB_00160969;
          if (puVar7[(img_row_3._4_4_ + 1) + lVar2] != '\0') goto LAB_00160969;
          if (puVar7[(img_row_3._4_4_ + 3) - lVar1] == '\0') {
            if (puVar7[img_row_3._4_4_ + 3] == '\0') {
              if (puVar7[iVar5 - lVar1] != '\0') {
                puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4);
                img_row_3._4_4_ = iVar5;
                goto LAB_001613f8;
              }
              puVar8[iVar5] = *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
              img_row_3._4_4_ = iVar5;
              goto LAB_001612fa;
            }
            if (puVar7[(img_row_3._4_4_ + 4) - lVar1] != '\0') {
              img_row_3._4_4_ = iVar5;
              if (puVar7[iVar5 - lVar1] != '\0') goto LAB_0015ee7c;
              goto LAB_0015f2f4;
            }
            if (puVar7[iVar5 - lVar1] != '\0') {
              puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4);
              img_row_3._4_4_ = iVar5;
              goto LAB_0016013c;
            }
            puVar8[iVar5] = *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
            img_row_3._4_4_ = iVar5;
            goto LAB_0015fe18;
          }
          img_row_3._4_4_ = iVar5;
          if (puVar7[iVar5 - lVar1] == '\0') {
LAB_0015f1cd:
            if (puVar7[img_row_3._4_4_ + lVar3] == '\0') {
              uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + -2) * 4 + lVar4)
                                  ,*(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4));
              puVar8[img_row_3._4_4_] = uVar6;
            }
            else {
              puVar8[img_row_3._4_4_] = *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
            }
          }
          else {
            puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4);
          }
        } while( true );
      }
      img_row_3._4_4_ = iVar5;
      if ((int)(uStack_18 - 2) < 0) {
        if (*puVar7 == '\0') {
LAB_001622c7:
          if (puVar7[img_row_3._4_4_ + lVar2] == '\0') {
            puVar8[img_row_3._4_4_] = 0;
          }
          else {
            uVar6 = UFPC::NewLabel();
            puVar8[img_row_3._4_4_] = uVar6;
          }
          goto LAB_00163b14;
        }
LAB_00162270:
        img_row_3._4_4_ = iVar5;
        if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
          uVar6 = UFPC::NewLabel();
          puVar8[img_row_3._4_4_] = uVar6;
        }
        else {
          puVar8[img_row_3._4_4_] = *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
        }
      }
      else if (*puVar7 == '\0') {
LAB_00162afb:
        iVar5 = img_row_3._4_4_;
        if (puVar7[img_row_3._4_4_ + lVar2] == '\0') {
LAB_00162b4f:
          img_row_3._4_4_ = iVar5;
          iVar5 = img_row_3._4_4_;
          if (puVar7[img_row_3._4_4_ + 1] != '\0') goto LAB_00162aaf;
LAB_00162b72:
          if (puVar7[(img_row_3._4_4_ + 1) + lVar2] == '\0') {
            puVar8[img_row_3._4_4_] = 0;
          }
          else {
            uVar6 = UFPC::NewLabel();
            puVar8[img_row_3._4_4_] = uVar6;
          }
        }
        else {
          if (puVar7[img_row_3._4_4_ + 1] != '\0') goto LAB_00162aaf;
          uVar6 = UFPC::NewLabel();
          puVar8[img_row_3._4_4_] = uVar6;
        }
      }
      else {
LAB_00162aaf:
        img_row_3._4_4_ = iVar5;
        iVar5 = img_row_3._4_4_;
        if (puVar7[(img_row_3._4_4_ + 1) - lVar1] == '\0') goto LAB_00162270;
        puVar8[img_row_3._4_4_] = *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
      }
LAB_00163b14:
    }
    if ((o_cols & 1U) != 0) {
      iVar5 = e_rows + -1;
      puVar7 = cv::Mat::ptr<unsigned_char>
                         (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                          iVar5);
      lVar1 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
      lVar2 = -**(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48 -
              lVar1;
      puVar8 = cv::Mat::ptr<unsigned_int>
                         (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                           super_Mat,iVar5);
      lVar3 = -**(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                           field_0x48 -
              **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->
                          field_0x48;
      img_row_4._4_4_ = -2;
LAB_00163bf6:
      iVar5 = img_row_4._4_4_ + 2;
      if (iVar5 < (int)(uStack_18 - 2)) {
        if (puVar7[iVar5] == '\0') goto LAB_00163e56;
        if (puVar7[(img_row_4._4_4_ + 3) - lVar1] != '\0') {
          puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3);
          img_row_4._4_4_ = iVar5;
          goto LAB_00164e70;
        }
        iVar9 = img_row_4._4_4_ + 3;
        img_row_4._4_4_ = iVar5;
        if (puVar7[iVar9] != '\0') {
LAB_00163ca9:
          if (puVar7[(img_row_4._4_4_ + 2) - lVar1] != '\0') {
            iVar5 = img_row_4._4_4_;
            if (puVar7[img_row_4._4_4_ - lVar1] != '\0') goto LAB_00163ce6;
            puVar8[img_row_4._4_4_] =
                 *(uint *)((long)puVar8 + (long)(img_row_4._4_4_ + 2) * 4 + lVar3);
            goto LAB_001648ef;
          }
          if (puVar7[img_row_4._4_4_ - lVar1] == '\0') {
            uVar6 = UFPC::NewLabel();
            puVar8[img_row_4._4_4_] = uVar6;
            goto LAB_00164330;
          }
          puVar8[img_row_4._4_4_] = *(uint *)((long)puVar8 + (long)img_row_4._4_4_ * 4 + lVar3);
LAB_0016459f:
          iVar5 = img_row_4._4_4_ + 2;
          if (iVar5 < (int)(uStack_18 - 2)) {
            if (puVar7[iVar5] == '\0') goto LAB_001644bd;
            if (puVar7[(img_row_4._4_4_ + 3) - lVar1] != '\0') {
              if (puVar7[iVar5 + lVar2] != '\0') goto LAB_0016462a;
              uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3),
                                  puVar8[img_row_4._4_4_]);
              puVar8[iVar5] = uVar6;
              img_row_4._4_4_ = iVar5;
              goto LAB_00164e70;
            }
            if (puVar7[img_row_4._4_4_ + 3] != '\0') {
              if (puVar7[(img_row_4._4_4_ + 4) - lVar1] == '\0') {
                puVar8[iVar5] = puVar8[img_row_4._4_4_];
                img_row_4._4_4_ = iVar5;
                goto LAB_00165074;
              }
              if (puVar7[(img_row_4._4_4_ + 3) + lVar2] == '\0') {
                uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)(img_row_4._4_4_ + 4) * 4 + lVar3
                                             ),puVar8[img_row_4._4_4_]);
                puVar8[iVar5] = uVar6;
                img_row_4._4_4_ = iVar5;
                goto LAB_001648ef;
              }
              if (puVar7[iVar5 + lVar2] == '\0') {
                uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)(img_row_4._4_4_ + 4) * 4 + lVar3
                                             ),puVar8[img_row_4._4_4_]);
                puVar8[iVar5] = uVar6;
                img_row_4._4_4_ = iVar5;
                goto LAB_001648ef;
              }
LAB_00164772:
              img_row_4._4_4_ = iVar5;
              if (puVar7[(img_row_4._4_4_ + -1) + lVar2] == '\0') {
                uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)(img_row_4._4_4_ + 2) * 4 + lVar3
                                             ),puVar8[img_row_4._4_4_ + -2]);
                puVar8[img_row_4._4_4_] = uVar6;
              }
              else {
                puVar8[img_row_4._4_4_] =
                     *(uint *)((long)puVar8 + (long)(img_row_4._4_4_ + 2) * 4 + lVar3);
              }
LAB_001648ef:
              do {
                iVar5 = img_row_4._4_4_ + 2;
                if ((int)(uStack_18 - 2) <= iVar5) {
                  if ((int)(uStack_18 - 2) < iVar5) goto LAB_001654cd;
                  if (puVar7[iVar5] == '\0') {
                    if (puVar7[img_row_4._4_4_ + 3] == '\0') {
                      puVar8[iVar5] = 0;
                    }
                    else {
                      puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3);
                    }
                  }
                  else if (puVar7[(img_row_4._4_4_ + 3) - lVar1] == '\0') {
                    puVar8[iVar5] = puVar8[img_row_4._4_4_];
                  }
                  else {
                    puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3);
                  }
                  goto LAB_00165e4f;
                }
                if (puVar7[iVar5] == '\0') {
                  if (puVar7[img_row_4._4_4_ + 3] == '\0') {
                    puVar8[iVar5] = 0;
                    img_row_4._4_4_ = iVar5;
                    goto LAB_00163ecf;
                  }
                  if (puVar7[(img_row_4._4_4_ + 3) - lVar1] != '\0') {
                    puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3);
                    img_row_4._4_4_ = iVar5;
                    goto LAB_00164b6b;
                  }
                  if (puVar7[(img_row_4._4_4_ + 4) - lVar1] == '\0') {
                    puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3);
                    img_row_4._4_4_ = iVar5;
                    goto LAB_0016459f;
                  }
LAB_00163ce6:
                  img_row_4._4_4_ = iVar5;
                  if (puVar7[(img_row_4._4_4_ + 1) + lVar2] == '\0') {
                    uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)img_row_4._4_4_ * 4 + lVar3),
                                        *(uint *)((long)puVar8 +
                                                 (long)(img_row_4._4_4_ + 2) * 4 + lVar3));
                    puVar8[img_row_4._4_4_] = uVar6;
                  }
                  else {
                    puVar8[img_row_4._4_4_] =
                         *(uint *)((long)puVar8 + (long)(img_row_4._4_4_ + 2) * 4 + lVar3);
                  }
                }
                else {
                  if (puVar7[(img_row_4._4_4_ + 3) - lVar1] != '\0') {
                    puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3);
                    img_row_4._4_4_ = iVar5;
                    goto LAB_00164e70;
                  }
                  if (puVar7[img_row_4._4_4_ + 3] == '\0') {
                    puVar8[iVar5] = puVar8[img_row_4._4_4_];
                    img_row_4._4_4_ = iVar5;
                    goto LAB_00163bf6;
                  }
                  if (puVar7[(img_row_4._4_4_ + 4) - lVar1] == '\0') {
                    puVar8[iVar5] = puVar8[img_row_4._4_4_];
                    img_row_4._4_4_ = iVar5;
LAB_00165074:
                    do {
                      iVar5 = img_row_4._4_4_ + 2;
                      if ((int)(uStack_18 - 2) <= iVar5) {
                        if ((int)(uStack_18 - 2) < iVar5) goto LAB_001654cd;
                        if (puVar7[iVar5] == '\0') goto LAB_00165895;
                        if (puVar7[(img_row_4._4_4_ + 3) - lVar1] == '\0') {
                          puVar8[iVar5] = puVar8[img_row_4._4_4_];
                          goto LAB_00165e4f;
                        }
                        if (puVar7[iVar5 + lVar2] == '\0') {
                          uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3),
                                              puVar8[img_row_4._4_4_]);
                          puVar8[iVar5] = uVar6;
                        }
                        else {
                          if (puVar7[img_row_4._4_4_ - lVar1] != '\0') goto LAB_0016597f;
                          uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3),
                                              puVar8[img_row_4._4_4_]);
                          puVar8[iVar5] = uVar6;
                        }
                        goto LAB_00165e4f;
                      }
                      if (puVar7[iVar5] == '\0') goto LAB_001644bd;
                      if (puVar7[(img_row_4._4_4_ + 3) - lVar1] != '\0') {
                        if (puVar7[iVar5 + lVar2] == '\0') {
                          uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3),
                                              puVar8[img_row_4._4_4_]);
                          puVar8[iVar5] = uVar6;
                          img_row_4._4_4_ = iVar5;
                        }
                        else if (puVar7[img_row_4._4_4_ - lVar1] == '\0') {
                          uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3),
                                              puVar8[img_row_4._4_4_]);
                          puVar8[iVar5] = uVar6;
                          img_row_4._4_4_ = iVar5;
                        }
                        else {
LAB_0016462a:
                          img_row_4._4_4_ = iVar5;
                          if (puVar7[(img_row_4._4_4_ + -1) + lVar2] == '\0') {
                            uVar6 = UFPC::Merge(*(uint *)((long)puVar8 +
                                                         (long)(img_row_4._4_4_ + -2) * 4 + lVar3),
                                                *(uint *)((long)puVar8 +
                                                         (long)img_row_4._4_4_ * 4 + lVar3));
                            puVar8[img_row_4._4_4_] = uVar6;
                          }
                          else {
                            puVar8[img_row_4._4_4_] =
                                 *(uint *)((long)puVar8 + (long)img_row_4._4_4_ * 4 + lVar3);
                          }
                        }
LAB_00164e70:
                        do {
                          iVar5 = img_row_4._4_4_ + 2;
                          if ((int)(uStack_18 - 2) <= iVar5) {
                            if ((int)(uStack_18 - 2) < iVar5) {
                              if (puVar7[iVar5] == '\0') {
                                puVar8[iVar5] = 0;
                                goto LAB_00165e4f;
                              }
                              if (puVar7[img_row_4._4_4_ + 1] != '\0') {
                                puVar8[iVar5] = puVar8[img_row_4._4_4_];
                                goto LAB_00165e4f;
                              }
                            }
                            else {
                              if (puVar7[iVar5] == '\0') goto LAB_0016566b;
                              if (puVar7[img_row_4._4_4_ + 1] != '\0') {
LAB_00165b6d:
                                img_row_4._4_4_ = iVar5;
                                if (puVar7[(img_row_4._4_4_ + 1) - lVar1] == '\0') {
                                  puVar8[img_row_4._4_4_] = puVar8[img_row_4._4_4_ + -2];
                                }
                                else if (puVar7[img_row_4._4_4_ - lVar1] == '\0') {
                                  if (puVar7[img_row_4._4_4_ + lVar2] == '\0') {
                                    uVar6 = UFPC::Merge(*(uint *)((long)puVar8 +
                                                                 (long)img_row_4._4_4_ * 4 + lVar3),
                                                        puVar8[img_row_4._4_4_ + -2]);
                                    puVar8[img_row_4._4_4_] = uVar6;
                                  }
                                  else {
                                    puVar8[img_row_4._4_4_] =
                                         *(uint *)((long)puVar8 + (long)img_row_4._4_4_ * 4 + lVar3)
                                    ;
                                  }
                                }
                                else {
                                  puVar8[img_row_4._4_4_] =
                                       *(uint *)((long)puVar8 + (long)img_row_4._4_4_ * 4 + lVar3);
                                }
                                goto LAB_00165e4f;
                              }
                              if (puVar7[(img_row_4._4_4_ + 3) - lVar1] != '\0') {
                                img_row_4._4_4_ = iVar5;
                                if (puVar7[iVar5 - lVar1] == '\0') {
LAB_0016573c:
                                  if (puVar7[img_row_4._4_4_ + lVar2] == '\0') {
                                    uVar6 = UFPC::Merge(*(uint *)((long)puVar8 +
                                                                 (long)(img_row_4._4_4_ + -2) * 4 +
                                                                 lVar3),
                                                        *(uint *)((long)puVar8 +
                                                                 (long)img_row_4._4_4_ * 4 + lVar3))
                                    ;
                                    puVar8[img_row_4._4_4_] = uVar6;
                                  }
                                  else {
                                    puVar8[img_row_4._4_4_] =
                                         *(uint *)((long)puVar8 + (long)img_row_4._4_4_ * 4 + lVar3)
                                    ;
                                  }
                                }
                                else {
                                  puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3);
                                }
                                goto LAB_00165e4f;
                              }
                            }
                            if (puVar7[iVar5 - lVar1] == '\0') {
                              puVar8[iVar5] =
                                   *(uint *)((long)puVar8 + (long)img_row_4._4_4_ * 4 + lVar3);
                            }
                            else {
                              puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3);
                            }
                            goto LAB_00165e4f;
                          }
                          if (puVar7[iVar5] == '\0') goto LAB_00163e56;
                          if (puVar7[img_row_4._4_4_ + 1] != '\0') {
LAB_00164bbb:
                            img_row_4._4_4_ = iVar5;
                            if (puVar7[(img_row_4._4_4_ + 1) - lVar1] == '\0') {
                              if (puVar7[img_row_4._4_4_ + 1] == '\0') {
                                puVar8[img_row_4._4_4_] = puVar8[img_row_4._4_4_ + -2];
                                goto LAB_00163bf6;
                              }
                              if (puVar7[(img_row_4._4_4_ + 2) - lVar1] == '\0') {
                                puVar8[img_row_4._4_4_] = puVar8[img_row_4._4_4_ + -2];
                                goto LAB_00165074;
                              }
                              if (puVar7[(img_row_4._4_4_ + 1) + lVar2] == '\0') {
                                uVar6 = UFPC::Merge(*(uint *)((long)puVar8 +
                                                             (long)(img_row_4._4_4_ + 2) * 4 + lVar3
                                                             ),puVar8[img_row_4._4_4_ + -2]);
                                puVar8[img_row_4._4_4_] = uVar6;
                              }
                              else if (puVar7[img_row_4._4_4_ - lVar1] == '\0') {
                                if (puVar7[img_row_4._4_4_ + lVar2] == '\0') {
                                  uVar6 = UFPC::Merge(*(uint *)((long)puVar8 +
                                                               (long)(img_row_4._4_4_ + 2) * 4 +
                                                               lVar3),puVar8[img_row_4._4_4_ + -2]);
                                  puVar8[img_row_4._4_4_] = uVar6;
                                }
                                else {
                                  puVar8[img_row_4._4_4_] =
                                       *(uint *)((long)puVar8 +
                                                (long)(img_row_4._4_4_ + 2) * 4 + lVar3);
                                }
                              }
                              else {
                                puVar8[img_row_4._4_4_] =
                                     *(uint *)((long)puVar8 +
                                              (long)(img_row_4._4_4_ + 2) * 4 + lVar3);
                              }
                              goto LAB_001648ef;
                            }
                            if (puVar7[img_row_4._4_4_ - lVar1] == '\0') {
                              if (puVar7[img_row_4._4_4_ + lVar2] == '\0') {
                                uVar6 = UFPC::Merge(*(uint *)((long)puVar8 +
                                                             (long)img_row_4._4_4_ * 4 + lVar3),
                                                    puVar8[img_row_4._4_4_ + -2]);
                                puVar8[img_row_4._4_4_] = uVar6;
                              }
                              else {
                                puVar8[img_row_4._4_4_] =
                                     *(uint *)((long)puVar8 + (long)img_row_4._4_4_ * 4 + lVar3);
                              }
                            }
                            else {
                              puVar8[img_row_4._4_4_] =
                                   *(uint *)((long)puVar8 + (long)img_row_4._4_4_ * 4 + lVar3);
                            }
                            goto LAB_00164e70;
                          }
                          if (puVar7[(img_row_4._4_4_ + 3) - lVar1] != '\0') {
                            img_row_4._4_4_ = iVar5;
                            if (puVar7[iVar5 - lVar1] == '\0') {
LAB_00163f9d:
                              if (puVar7[img_row_4._4_4_ + lVar2] == '\0') {
                                uVar6 = UFPC::Merge(*(uint *)((long)puVar8 +
                                                             (long)(img_row_4._4_4_ + -2) * 4 +
                                                             lVar3),
                                                    *(uint *)((long)puVar8 +
                                                             (long)img_row_4._4_4_ * 4 + lVar3));
                                puVar8[img_row_4._4_4_] = uVar6;
                              }
                              else {
                                puVar8[img_row_4._4_4_] =
                                     *(uint *)((long)puVar8 + (long)img_row_4._4_4_ * 4 + lVar3);
                              }
                            }
                            else {
                              puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3);
                            }
                            goto LAB_00164e70;
                          }
                          if (puVar7[img_row_4._4_4_ + 3] == '\0') {
                            if (puVar7[iVar5 - lVar1] == '\0') {
                              puVar8[iVar5] =
                                   *(uint *)((long)puVar8 + (long)img_row_4._4_4_ * 4 + lVar3);
                              img_row_4._4_4_ = iVar5;
                            }
                            else {
                              puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3);
                              img_row_4._4_4_ = iVar5;
                            }
                            goto LAB_00163bf6;
                          }
                          if (puVar7[(img_row_4._4_4_ + 4) - lVar1] != '\0') {
                            if (puVar7[iVar5 - lVar1] != '\0') goto LAB_00163ce6;
LAB_001640c4:
                            img_row_4._4_4_ = iVar5;
                            if (puVar7[(img_row_4._4_4_ + 1) + lVar2] == '\0') {
                              uVar6 = UFPC::Merge(*(uint *)((long)puVar8 +
                                                           (long)(img_row_4._4_4_ + -2) * 4 + lVar3)
                                                  ,*(uint *)((long)puVar8 +
                                                            (long)(img_row_4._4_4_ + 2) * 4 + lVar3)
                                                 );
                              puVar8[img_row_4._4_4_] = uVar6;
                            }
                            else if (puVar7[img_row_4._4_4_ + lVar2] == '\0') {
                              uVar6 = UFPC::Merge(*(uint *)((long)puVar8 +
                                                           (long)(img_row_4._4_4_ + -2) * 4 + lVar3)
                                                  ,*(uint *)((long)puVar8 +
                                                            (long)(img_row_4._4_4_ + 2) * 4 + lVar3)
                                                 );
                              puVar8[img_row_4._4_4_] = uVar6;
                            }
                            else {
                              puVar8[img_row_4._4_4_] =
                                   *(uint *)((long)puVar8 + (long)(img_row_4._4_4_ + 2) * 4 + lVar3)
                              ;
                            }
                            goto LAB_001648ef;
                          }
                          if (puVar7[iVar5 - lVar1] != '\0') {
                            puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3);
                            img_row_4._4_4_ = iVar5;
                            goto LAB_0016459f;
                          }
                          puVar8[iVar5] =
                               *(uint *)((long)puVar8 + (long)img_row_4._4_4_ * 4 + lVar3);
                          img_row_4._4_4_ = iVar5;
LAB_00164330:
                          iVar5 = img_row_4._4_4_ + 2;
                          if ((int)(uStack_18 - 2) <= iVar5) {
                            if ((int)(uStack_18 - 2) < iVar5) goto LAB_001654cd;
                            if (puVar7[iVar5] == '\0') goto LAB_00165895;
                            if (puVar7[(img_row_4._4_4_ + 3) - lVar1] == '\0') {
                              puVar8[iVar5] = puVar8[img_row_4._4_4_];
                            }
                            else {
                              uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3),
                                                  puVar8[img_row_4._4_4_]);
                              puVar8[iVar5] = uVar6;
                            }
                            goto LAB_00165e4f;
                          }
                          if (puVar7[iVar5] == '\0') {
LAB_001644bd:
                            img_row_4._4_4_ = iVar5;
                            if (puVar7[img_row_4._4_4_ + 1] == '\0') {
                              puVar8[img_row_4._4_4_] = 0;
                              goto LAB_00163ecf;
                            }
                            if (puVar7[(img_row_4._4_4_ + 1) - lVar1] != '\0') {
                              puVar8[img_row_4._4_4_] =
                                   *(uint *)((long)puVar8 + (long)img_row_4._4_4_ * 4 + lVar3);
LAB_00164b6b:
                              while (iVar5 = img_row_4._4_4_ + 2, iVar5 < (int)(uStack_18 - 2)) {
                                if (puVar7[iVar5] != '\0') goto LAB_00164bbb;
LAB_00163e56:
                                while (img_row_4._4_4_ = iVar5, puVar7[img_row_4._4_4_ + 1] == '\0')
                                {
                                  puVar8[img_row_4._4_4_] = 0;
LAB_00163ecf:
                                  iVar5 = img_row_4._4_4_ + 2;
                                  if ((int)(uStack_18 - 2) <= iVar5) {
                                    if ((int)(uStack_18 - 2) < iVar5) {
                                      if (puVar7[iVar5] == '\0') {
                                        puVar8[iVar5] = 0;
                                        goto LAB_00165e4f;
                                      }
                                    }
                                    else {
                                      if (puVar7[iVar5] == '\0') goto LAB_0016566b;
                                      if (puVar7[(img_row_4._4_4_ + 3) - lVar1] != '\0') {
                                        if (puVar7[iVar5 - lVar1] == '\0') {
                                          iVar9 = img_row_4._4_4_ + 1;
                                          img_row_4._4_4_ = iVar5;
                                          if (puVar7[iVar9 - lVar1] != '\0') goto LAB_0016573c;
                                          puVar8[iVar5] =
                                               *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3);
                                        }
                                        else {
                                          puVar8[iVar5] =
                                               *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3);
                                        }
                                        goto LAB_00165e4f;
                                      }
                                    }
                                    if (puVar7[iVar5 - lVar1] == '\0') {
                                      if (puVar7[(img_row_4._4_4_ + 1) - lVar1] == '\0') {
                                        uVar6 = UFPC::NewLabel();
                                        puVar8[iVar5] = uVar6;
                                      }
                                      else {
                                        puVar8[iVar5] =
                                             *(uint *)((long)puVar8 +
                                                      (long)img_row_4._4_4_ * 4 + lVar3);
                                      }
                                    }
                                    else {
                                      puVar8[iVar5] =
                                           *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3);
                                    }
                                    goto LAB_00165e4f;
                                  }
                                  if (puVar7[iVar5] != '\0') {
                                    if (puVar7[(img_row_4._4_4_ + 3) - lVar1] != '\0') {
                                      if (puVar7[iVar5 - lVar1] == '\0') {
                                        iVar9 = img_row_4._4_4_ + 1;
                                        img_row_4._4_4_ = iVar5;
                                        if (puVar7[iVar9 - lVar1] != '\0') goto LAB_00163f9d;
                                        puVar8[iVar5] =
                                             *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3);
                                      }
                                      else {
                                        puVar8[iVar5] =
                                             *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3);
                                        img_row_4._4_4_ = iVar5;
                                      }
                                      goto LAB_00164e70;
                                    }
                                    if (puVar7[img_row_4._4_4_ + 3] == '\0') {
                                      if (puVar7[iVar5 - lVar1] == '\0') {
                                        if (puVar7[(img_row_4._4_4_ + 1) - lVar1] == '\0') {
                                          uVar6 = UFPC::NewLabel();
                                          puVar8[iVar5] = uVar6;
                                          img_row_4._4_4_ = iVar5;
                                        }
                                        else {
                                          puVar8[iVar5] =
                                               *(uint *)((long)puVar8 +
                                                        (long)img_row_4._4_4_ * 4 + lVar3);
                                          img_row_4._4_4_ = iVar5;
                                        }
                                      }
                                      else {
                                        puVar8[iVar5] =
                                             *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3);
                                        img_row_4._4_4_ = iVar5;
                                      }
                                      goto LAB_00163bf6;
                                    }
                                    if (puVar7[(img_row_4._4_4_ + 4) - lVar1] != '\0') {
                                      if (puVar7[iVar5 - lVar1] != '\0') goto LAB_00163ce6;
                                      if (puVar7[(img_row_4._4_4_ + 1) - lVar1] != '\0')
                                      goto LAB_001640c4;
                                      puVar8[iVar5] =
                                           *(uint *)((long)puVar8 +
                                                    (long)(img_row_4._4_4_ + 4) * 4 + lVar3);
                                      img_row_4._4_4_ = iVar5;
                                      goto LAB_001648ef;
                                    }
                                    if (puVar7[iVar5 - lVar1] != '\0') {
                                      puVar8[iVar5] =
                                           *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3);
                                      img_row_4._4_4_ = iVar5;
                                      goto LAB_0016459f;
                                    }
                                    if (puVar7[(img_row_4._4_4_ + 1) - lVar1] == '\0') {
                                      uVar6 = UFPC::NewLabel();
                                      puVar8[iVar5] = uVar6;
                                      img_row_4._4_4_ = iVar5;
                                    }
                                    else {
                                      puVar8[iVar5] =
                                           *(uint *)((long)puVar8 +
                                                    (long)img_row_4._4_4_ * 4 + lVar3);
                                      img_row_4._4_4_ = iVar5;
                                    }
                                    goto LAB_00164330;
                                  }
                                }
                                if (puVar7[(img_row_4._4_4_ + 1) - lVar1] == '\0')
                                goto LAB_00163ca9;
                                puVar8[img_row_4._4_4_] =
                                     *(uint *)((long)puVar8 + (long)img_row_4._4_4_ * 4 + lVar3);
                              }
                              if ((int)(uStack_18 - 2) < iVar5) goto LAB_001654cd;
                              if (puVar7[iVar5] != '\0') goto LAB_00165b6d;
                              goto LAB_0016566b;
                            }
                            if (puVar7[(img_row_4._4_4_ + 2) - lVar1] != '\0') {
                              puVar8[img_row_4._4_4_] =
                                   *(uint *)((long)puVar8 + (long)(img_row_4._4_4_ + 2) * 4 + lVar3)
                              ;
                              goto LAB_001648ef;
                            }
                            uVar6 = UFPC::NewLabel();
                            puVar8[img_row_4._4_4_] = uVar6;
                            goto LAB_00164330;
                          }
                          if (puVar7[(img_row_4._4_4_ + 3) - lVar1] == '\0') goto LAB_001643de;
                          uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3),
                                              puVar8[img_row_4._4_4_]);
                          puVar8[iVar5] = uVar6;
                          img_row_4._4_4_ = iVar5;
                        } while( true );
                      }
                      if (puVar7[img_row_4._4_4_ + 3] == '\0') {
                        puVar8[iVar5] = puVar8[img_row_4._4_4_];
                        img_row_4._4_4_ = iVar5;
                        goto LAB_00163bf6;
                      }
                      if (puVar7[(img_row_4._4_4_ + 4) - lVar1] != '\0') {
                        if (puVar7[(img_row_4._4_4_ + 3) + lVar2] == '\0') {
                          uVar6 = UFPC::Merge(*(uint *)((long)puVar8 +
                                                       (long)(img_row_4._4_4_ + 4) * 4 + lVar3),
                                              puVar8[img_row_4._4_4_]);
                          puVar8[iVar5] = uVar6;
                          img_row_4._4_4_ = iVar5;
                          goto LAB_001648ef;
                        }
                        if (puVar7[iVar5 + lVar2] == '\0') {
                          uVar6 = UFPC::Merge(*(uint *)((long)puVar8 +
                                                       (long)(img_row_4._4_4_ + 4) * 4 + lVar3),
                                              puVar8[img_row_4._4_4_]);
                          puVar8[iVar5] = uVar6;
                          img_row_4._4_4_ = iVar5;
                        }
                        else {
                          if (puVar7[img_row_4._4_4_ - lVar1] != '\0') goto LAB_00164772;
                          uVar6 = UFPC::Merge(*(uint *)((long)puVar8 +
                                                       (long)(img_row_4._4_4_ + 4) * 4 + lVar3),
                                              puVar8[img_row_4._4_4_]);
                          puVar8[iVar5] = uVar6;
                          img_row_4._4_4_ = iVar5;
                        }
                        goto LAB_001648ef;
                      }
                      puVar8[iVar5] = puVar8[img_row_4._4_4_];
                      img_row_4._4_4_ = iVar5;
                    } while( true );
                  }
                  if (puVar7[(img_row_4._4_4_ + 3) + lVar2] == '\0') {
                    uVar6 = UFPC::Merge(*(uint *)((long)puVar8 +
                                                 (long)(img_row_4._4_4_ + 4) * 4 + lVar3),
                                        puVar8[img_row_4._4_4_]);
                    puVar8[iVar5] = uVar6;
                    img_row_4._4_4_ = iVar5;
                  }
                  else {
                    puVar8[iVar5] =
                         *(uint *)((long)puVar8 + (long)(img_row_4._4_4_ + 4) * 4 + lVar3);
                    img_row_4._4_4_ = iVar5;
                  }
                }
              } while( true );
            }
            puVar8[iVar5] = puVar8[img_row_4._4_4_];
            img_row_4._4_4_ = iVar5;
            goto LAB_00163bf6;
          }
          if ((int)(uStack_18 - 2) < iVar5) {
LAB_001654cd:
            img_row_4._4_4_ = iVar5;
            if (puVar7[img_row_4._4_4_] == '\0') {
              puVar8[img_row_4._4_4_] = 0;
            }
            else {
              puVar8[img_row_4._4_4_] = puVar8[img_row_4._4_4_ + -2];
            }
          }
          else if (puVar7[iVar5] == '\0') {
LAB_00165895:
            img_row_4._4_4_ = iVar5;
            if (puVar7[img_row_4._4_4_ + 1] == '\0') {
              puVar8[img_row_4._4_4_] = 0;
            }
            else if (puVar7[(img_row_4._4_4_ + 1) - lVar1] == '\0') {
              uVar6 = UFPC::NewLabel();
              puVar8[img_row_4._4_4_] = uVar6;
            }
            else {
              puVar8[img_row_4._4_4_] = *(uint *)((long)puVar8 + (long)img_row_4._4_4_ * 4 + lVar3);
            }
          }
          else if (puVar7[(img_row_4._4_4_ + 3) - lVar1] == '\0') {
            puVar8[iVar5] = puVar8[img_row_4._4_4_];
          }
          else if (puVar7[iVar5 + lVar2] == '\0') {
            uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3),
                                puVar8[img_row_4._4_4_]);
            puVar8[iVar5] = uVar6;
          }
          else {
LAB_0016597f:
            img_row_4._4_4_ = iVar5;
            if (puVar7[(img_row_4._4_4_ + -1) + lVar2] == '\0') {
              uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)(img_row_4._4_4_ + -2) * 4 + lVar3)
                                  ,*(uint *)((long)puVar8 + (long)img_row_4._4_4_ * 4 + lVar3));
              puVar8[img_row_4._4_4_] = uVar6;
            }
            else {
              puVar8[img_row_4._4_4_] = *(uint *)((long)puVar8 + (long)img_row_4._4_4_ * 4 + lVar3);
            }
          }
          goto LAB_00165e4f;
        }
        if (puVar7[iVar5 - lVar1] == '\0') {
          uVar6 = UFPC::NewLabel();
          puVar8[iVar5] = uVar6;
        }
        else {
          puVar8[iVar5] = *(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar3);
        }
        goto LAB_00163bf6;
      }
      if ((int)(uStack_18 - 2) < iVar5) {
        img_row_4._4_4_ = iVar5;
        if (puVar7[iVar5] == '\0') {
          puVar8[iVar5] = 0;
          goto LAB_00165e4f;
        }
      }
      else {
        img_row_4._4_4_ = iVar5;
        if (puVar7[iVar5] == '\0') {
LAB_0016566b:
          img_row_4._4_4_ = iVar5;
          if (puVar7[img_row_4._4_4_ + 1] == '\0') {
            puVar8[img_row_4._4_4_] = 0;
            goto LAB_00165e4f;
          }
        }
        if (puVar7[(img_row_4._4_4_ + 1) - lVar1] != '\0') {
          puVar8[img_row_4._4_4_] = *(uint *)((long)puVar8 + (long)img_row_4._4_4_ * 4 + lVar3);
          goto LAB_00165e4f;
        }
      }
      if (puVar7[img_row_4._4_4_ - lVar1] == '\0') {
        uVar6 = UFPC::NewLabel();
        puVar8[img_row_4._4_4_] = uVar6;
      }
      else {
        puVar8[img_row_4._4_4_] = *(uint *)((long)puVar8 + (long)img_row_4._4_4_ * 4 + lVar3);
      }
    }
  }
LAB_00165e4f:
  uVar6 = UFPC::Flatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar6;
  for (img_row_4._0_4_ = 0; (int)img_row_4 < e_cols; img_row_4._0_4_ = (int)img_row_4 + 2) {
    puVar7 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                        (int)img_row_4);
    lVar1 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
    puVar8 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                        ,(int)img_row_4);
    lVar2 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x48
    ;
    for (iLabel_1 = 0; iLabel_1 < (int)local_24; iLabel_1 = iLabel_1 + 2) {
      if ((int)puVar8[iLabel_1] < 1) {
        puVar8[iLabel_1] = 0;
        puVar8[iLabel_1 + 1] = 0;
        *(undefined4 *)((long)puVar8 + (long)iLabel_1 * 4 + lVar2) = 0;
        *(undefined4 *)((long)puVar8 + (long)(iLabel_1 + 1) * 4 + lVar2) = 0;
      }
      else {
        uVar6 = UFPC::GetLabel(puVar8[iLabel_1]);
        if (puVar7[iLabel_1] == '\0') {
          puVar8[iLabel_1] = 0;
        }
        else {
          puVar8[iLabel_1] = uVar6;
        }
        if (puVar7[iLabel_1 + 1] == '\0') {
          puVar8[iLabel_1 + 1] = 0;
        }
        else {
          puVar8[iLabel_1 + 1] = uVar6;
        }
        if (puVar7[iLabel_1 + lVar1] == '\0') {
          *(undefined4 *)((long)puVar8 + (long)iLabel_1 * 4 + lVar2) = 0;
        }
        else {
          *(uint *)((long)puVar8 + (long)iLabel_1 * 4 + lVar2) = uVar6;
        }
        if (puVar7[(iLabel_1 + 1) + lVar1] == '\0') {
          *(undefined4 *)((long)puVar8 + (long)(iLabel_1 + 1) * 4 + lVar2) = 0;
        }
        else {
          *(uint *)((long)puVar8 + (long)(iLabel_1 + 1) * 4 + lVar2) = uVar6;
        }
      }
    }
    if ((local_25 & 1) != 0) {
      if ((int)puVar8[iLabel_1] < 1) {
        puVar8[iLabel_1] = 0;
        *(undefined4 *)((long)puVar8 + (long)iLabel_1 * 4 + lVar2) = 0;
      }
      else {
        uVar6 = UFPC::GetLabel(puVar8[iLabel_1]);
        if (puVar7[iLabel_1] == '\0') {
          puVar8[iLabel_1] = 0;
        }
        else {
          puVar8[iLabel_1] = uVar6;
        }
        if (puVar7[iLabel_1 + lVar1] == '\0') {
          *(undefined4 *)((long)puVar8 + (long)iLabel_1 * 4 + lVar2) = 0;
        }
        else {
          *(uint *)((long)puVar8 + (long)iLabel_1 * 4 + lVar2) = uVar6;
        }
      }
    }
  }
  if ((o_cols & 1U) != 0) {
    puVar7 = cv::Mat::ptr<unsigned_char>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat,
                        (int)img_row_4);
    puVar8 = cv::Mat::ptr<unsigned_int>
                       (&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat
                        ,(int)img_row_4);
    for (iLabel_3 = 0; iLabel_3 < (int)local_24; iLabel_3 = iLabel_3 + 2) {
      if ((int)puVar8[iLabel_3] < 1) {
        puVar8[iLabel_3] = 0;
        puVar8[iLabel_3 + 1] = 0;
      }
      else {
        uVar6 = UFPC::GetLabel(puVar8[iLabel_3]);
        if (puVar7[iLabel_3] == '\0') {
          puVar8[iLabel_3] = 0;
        }
        else {
          puVar8[iLabel_3] = uVar6;
        }
        if (puVar7[iLabel_3 + 1] == '\0') {
          puVar8[iLabel_3 + 1] = 0;
        }
        else {
          puVar8[iLabel_3 + 1] = uVar6;
        }
      }
    }
    if ((local_25 & 1) != 0) {
      if ((int)puVar8[iLabel_3] < 1) {
        puVar8[iLabel_3] = 0;
      }
      else {
        uVar6 = UFPC::GetLabel(puVar8[iLabel_3]);
        if (puVar7[iLabel_3] == '\0') {
          puVar8[iLabel_3] = 0;
        }
        else {
          puVar8[iLabel_3] = uVar6;
        }
      }
    }
  }
  UFPC::Dealloc();
  return;
LAB_00160969:
  img_row_3._4_4_ = iVar5;
  if (puVar7[(img_row_3._4_4_ + 1) - lVar1] != '\0') {
LAB_0016098b:
    if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
      if (puVar7[img_row_3._4_4_ + lVar3] == '\0') {
        uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4),
                            puVar8[img_row_3._4_4_ + -2]);
        puVar8[img_row_3._4_4_] = uVar6;
      }
      else {
        puVar8[img_row_3._4_4_] = *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
      }
    }
    else {
      puVar8[img_row_3._4_4_] = *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
    }
    goto LAB_00161976;
  }
  if (puVar7[img_row_3._4_4_ + 1] == '\0') {
    puVar8[img_row_3._4_4_] = puVar8[img_row_3._4_4_ + -2];
    goto LAB_00161d75;
  }
LAB_00160a6d:
  iVar5 = img_row_3._4_4_;
  if (puVar7[(img_row_3._4_4_ + 2) - lVar1] != '\0') goto LAB_00160a8f;
  puVar8[img_row_3._4_4_] = puVar8[img_row_3._4_4_ + -2];
  goto LAB_00160eae;
LAB_00160292:
  if (puVar7[img_row_3._4_4_ + 3] == '\0') {
    puVar8[iVar5] = puVar8[img_row_3._4_4_];
    img_row_3._4_4_ = iVar5;
LAB_00161d75:
    iVar5 = img_row_3._4_4_ + 2;
    if ((int)(uStack_18 - 2) <= iVar5) {
      if ((int)(uStack_18 - 2) < iVar5) {
        if (puVar7[iVar5] == '\0') goto LAB_001625c5;
        if (puVar7[(img_row_3._4_4_ + 1) + lVar2] == '\0') goto LAB_00162270;
      }
      else {
        if (puVar7[iVar5] == '\0') {
          if (puVar7[iVar5 + lVar2] == '\0') goto LAB_00162b4f;
          if (puVar7[img_row_3._4_4_ + 3] == '\0') goto LAB_001625de;
        }
        if (puVar7[(img_row_3._4_4_ + 1) + lVar2] == '\0') goto LAB_00162aaf;
        if (puVar7[(img_row_3._4_4_ + 3) - lVar1] != '\0') {
          if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
            uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4),
                                puVar8[img_row_3._4_4_]);
            puVar8[iVar5] = uVar6;
            goto LAB_00163b14;
          }
LAB_00163768:
          img_row_3._4_4_ = iVar5;
          iVar5 = img_row_3._4_4_;
          if (puVar7[(img_row_3._4_4_ + -1) + lVar3] != '\0') goto LAB_001633cd;
          uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4),
                              puVar8[img_row_3._4_4_ + -2]);
          puVar8[img_row_3._4_4_] = uVar6;
          goto LAB_00163b14;
        }
      }
      if (puVar7[iVar5 - lVar1] != '\0') goto LAB_001629fa;
      puVar8[iVar5] = puVar8[img_row_3._4_4_];
      goto LAB_00163b14;
    }
    if (puVar7[iVar5] == '\0') {
      if (puVar7[iVar5 + lVar2] == '\0') goto LAB_0015f08c;
      if (puVar7[img_row_3._4_4_ + 3] == '\0') goto LAB_00160e44;
      if (puVar7[(img_row_3._4_4_ + 1) + lVar2] == '\0') goto LAB_0015f025;
      if (puVar7[(img_row_3._4_4_ + 3) - lVar1] != '\0') {
        if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
          uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4),
                              puVar8[img_row_3._4_4_]);
          puVar8[iVar5] = uVar6;
          img_row_3._4_4_ = iVar5;
          goto LAB_00160919;
        }
LAB_001618fd:
        img_row_3._4_4_ = iVar5;
        iVar5 = img_row_3._4_4_;
        if (puVar7[(img_row_3._4_4_ + -1) + lVar3] != '\0') goto LAB_00160c80;
        uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4),
                            puVar8[img_row_3._4_4_ + -2]);
        puVar8[img_row_3._4_4_] = uVar6;
        goto LAB_00160919;
      }
    }
    else {
      if (puVar7[(img_row_3._4_4_ + 1) + lVar2] == '\0') goto LAB_0015edda;
      if (puVar7[(img_row_3._4_4_ + 3) - lVar1] != '\0') {
        if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
          uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4),
                              puVar8[img_row_3._4_4_]);
          puVar8[iVar5] = uVar6;
          img_row_3._4_4_ = iVar5;
          goto LAB_00161976;
        }
LAB_00161484:
        img_row_3._4_4_ = iVar5;
        if (puVar7[(img_row_3._4_4_ + -1) + lVar3] != '\0') goto LAB_0016098b;
        uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4),
                            puVar8[img_row_3._4_4_ + -2]);
        puVar8[img_row_3._4_4_] = uVar6;
        goto LAB_00161976;
      }
      if (puVar7[img_row_3._4_4_ + 3] == '\0') {
        if (puVar7[iVar5 - lVar1] == '\0') {
          puVar8[iVar5] = puVar8[img_row_3._4_4_];
          img_row_3._4_4_ = iVar5;
          goto LAB_001612fa;
        }
        if (puVar7[img_row_3._4_4_ - lVar1] != '\0') goto LAB_001617cc;
        uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4),
                            puVar8[img_row_3._4_4_]);
        puVar8[iVar5] = uVar6;
        img_row_3._4_4_ = iVar5;
LAB_001613f8:
        while (iVar5 = img_row_3._4_4_ + 2, iVar5 < (int)(uStack_18 - 2)) {
          if (puVar7[iVar5] == '\0') {
            if (puVar7[iVar5 + lVar2] != '\0') {
              if (puVar7[img_row_3._4_4_ + 3] == '\0') goto LAB_00160e44;
              if (puVar7[(img_row_3._4_4_ + 1) + lVar2] == '\0') goto LAB_0015f025;
              if (puVar7[(img_row_3._4_4_ + 3) - lVar1] == '\0') goto LAB_0016150b;
              goto LAB_001618fd;
            }
LAB_0015f08c:
            while( true ) {
              while( true ) {
                img_row_3._4_4_ = iVar5;
                iVar5 = img_row_3._4_4_;
                if (puVar7[img_row_3._4_4_ + 1] != '\0') goto LAB_0015f025;
LAB_0015f0af:
                img_row_3._4_4_ = iVar5;
                if (puVar7[(img_row_3._4_4_ + 1) + lVar2] == '\0') break;
                uVar6 = UFPC::NewLabel();
                puVar8[img_row_3._4_4_] = uVar6;
                iVar5 = img_row_3._4_4_ + 2;
                if ((int)(uStack_18 - 2) <= iVar5) {
                  if ((int)(uStack_18 - 2) < iVar5) {
                    img_row_3._4_4_ = iVar5;
                    if (puVar7[iVar5] != '\0') goto LAB_001623f4;
                    goto LAB_001624e0;
                  }
                  if (puVar7[iVar5] != '\0') goto LAB_00162d31;
                  if (puVar7[iVar5 + lVar2] == '\0') goto LAB_00162b4f;
                  if (puVar7[img_row_3._4_4_ + 3] != '\0') goto LAB_00162f08;
                  puVar8[iVar5] = puVar8[img_row_3._4_4_];
                  goto LAB_00163b14;
                }
                if (puVar7[iVar5] != '\0') goto LAB_0015f5b0;
                if (puVar7[iVar5 + lVar2] != '\0') {
                  if (puVar7[img_row_3._4_4_ + 3] != '\0') goto LAB_0015fc3a;
                  puVar8[iVar5] = puVar8[img_row_3._4_4_];
                  img_row_3._4_4_ = iVar5;
                  goto LAB_00160d73;
                }
              }
              puVar8[img_row_3._4_4_] = 0;
              img_row_3._4_4_ = img_row_3._4_4_ + 2;
              if ((int)(uStack_18 - 2) <= img_row_3._4_4_) {
                if (img_row_3._4_4_ <= (int)(uStack_18 - 2)) {
                  if (puVar7[img_row_3._4_4_] != '\0') goto LAB_00162be5;
                  goto LAB_00162afb;
                }
                if (puVar7[img_row_3._4_4_] != '\0') goto LAB_00162331;
                goto LAB_001622c7;
              }
              if (puVar7[img_row_3._4_4_] != '\0') break;
LAB_0015efec:
              iVar5 = img_row_3._4_4_;
              if (puVar7[img_row_3._4_4_ + lVar2] != '\0') {
                if (puVar7[img_row_3._4_4_ + 1] != '\0') goto LAB_0015f025;
                uVar6 = UFPC::NewLabel();
                puVar8[img_row_3._4_4_] = uVar6;
                goto LAB_00160d73;
              }
            }
LAB_0015f14d:
            if (puVar7[(img_row_3._4_4_ + 1) - lVar1] != '\0') {
              if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
                if (puVar7[(img_row_3._4_4_ + -1) - lVar1] != '\0') goto LAB_0015f1cd;
                puVar8[img_row_3._4_4_] =
                     *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
              }
              else {
                puVar8[img_row_3._4_4_] =
                     *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
              }
              goto LAB_00161976;
            }
            if (puVar7[img_row_3._4_4_ + 1] != '\0') {
              if (puVar7[(img_row_3._4_4_ + 2) - lVar1] == '\0') {
                if (puVar7[img_row_3._4_4_ - lVar1] != '\0') {
                  puVar8[img_row_3._4_4_] =
                       *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
                  goto LAB_0016013c;
                }
                if (puVar7[(img_row_3._4_4_ + -1) - lVar1] == '\0') {
                  uVar6 = UFPC::NewLabel();
                  puVar8[img_row_3._4_4_] = uVar6;
                }
                else {
                  puVar8[img_row_3._4_4_] =
                       *(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + -2) * 4 + lVar4);
                }
                goto LAB_0015fe18;
              }
              if (puVar7[img_row_3._4_4_ - lVar1] != '\0') goto LAB_0015ee7c;
              if (puVar7[(img_row_3._4_4_ + -1) - lVar1] == '\0') {
                puVar8[img_row_3._4_4_] =
                     *(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 2) * 4 + lVar4);
              }
              else {
LAB_0015f2f4:
                if (puVar7[(img_row_3._4_4_ + 1) + lVar3] == '\0') {
                  uVar6 = UFPC::Merge(*(uint *)((long)puVar8 +
                                               (long)(img_row_3._4_4_ + -2) * 4 + lVar4),
                                      *(uint *)((long)puVar8 +
                                               (long)(img_row_3._4_4_ + 2) * 4 + lVar4));
                  puVar8[img_row_3._4_4_] = uVar6;
                }
                else if (puVar7[img_row_3._4_4_ + lVar3] == '\0') {
                  uVar6 = UFPC::Merge(*(uint *)((long)puVar8 +
                                               (long)(img_row_3._4_4_ + -2) * 4 + lVar4),
                                      *(uint *)((long)puVar8 +
                                               (long)(img_row_3._4_4_ + 2) * 4 + lVar4));
                  puVar8[img_row_3._4_4_] = uVar6;
                }
                else {
                  puVar8[img_row_3._4_4_] =
                       *(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 2) * 4 + lVar4);
                }
              }
              goto LAB_00160605;
            }
            if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
              if (puVar7[(img_row_3._4_4_ + -1) - lVar1] == '\0') {
                uVar6 = UFPC::NewLabel();
                puVar8[img_row_3._4_4_] = uVar6;
              }
              else {
                puVar8[img_row_3._4_4_] =
                     *(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + -2) * 4 + lVar4);
              }
              goto LAB_001612fa;
            }
            puVar8[img_row_3._4_4_] = *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
          }
          else {
            if (puVar7[(img_row_3._4_4_ + 1) + lVar2] == '\0') goto LAB_0015edda;
            if (puVar7[(img_row_3._4_4_ + 3) - lVar1] != '\0') goto LAB_00161484;
            if (puVar7[img_row_3._4_4_ + 3] != '\0') {
LAB_0016150b:
              if (puVar7[(img_row_3._4_4_ + 4) - lVar1] == '\0') {
                if (puVar7[iVar5 - lVar1] != '\0') goto LAB_001616fc;
                puVar8[iVar5] = puVar8[img_row_3._4_4_];
                img_row_3._4_4_ = iVar5;
                goto LAB_0015fe18;
              }
              if (puVar7[(img_row_3._4_4_ + 3) + lVar3] != '\0') goto LAB_00161549;
              if (puVar7[iVar5 - lVar1] != '\0') goto LAB_001615d0;
              uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 4) * 4 + lVar4),
                                  puVar8[img_row_3._4_4_]);
              puVar8[iVar5] = uVar6;
              img_row_3._4_4_ = iVar5;
              goto LAB_00160605;
            }
            if (puVar7[iVar5 - lVar1] == '\0') {
              puVar8[iVar5] = puVar8[img_row_3._4_4_];
              img_row_3._4_4_ = iVar5;
LAB_001612fa:
              while( true ) {
                iVar5 = img_row_3._4_4_ + 2;
                if ((int)(uStack_18 - 2) <= iVar5) {
                  if (iVar5 <= (int)(uStack_18 - 2)) {
                    img_row_3._4_4_ = iVar5;
                    if (puVar7[iVar5] != '\0') goto LAB_00163590;
                    goto LAB_0016355b;
                  }
                  if (puVar7[iVar5] == '\0') goto LAB_001625c5;
                  iVar9 = img_row_3._4_4_ + 1;
                  img_row_3._4_4_ = iVar5;
                  if (puVar7[iVar9 + lVar2] != '\0') goto LAB_0016245b;
                  goto LAB_00162270;
                }
                if (puVar7[iVar5] == '\0') goto LAB_00160de5;
                if (puVar7[(img_row_3._4_4_ + 1) + lVar2] == '\0') goto LAB_0015edda;
                if (puVar7[(img_row_3._4_4_ + 3) - lVar1] != '\0') {
                  uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4),
                                      puVar8[img_row_3._4_4_]);
                  puVar8[iVar5] = uVar6;
                  img_row_3._4_4_ = iVar5;
                  goto LAB_00161976;
                }
                iVar9 = img_row_3._4_4_ + 3;
                img_row_3._4_4_ = iVar5;
                if (puVar7[iVar9] != '\0') goto LAB_0015fc9c;
LAB_0015fb76:
                if (puVar7[img_row_3._4_4_ - lVar1] != '\0') break;
                puVar8[img_row_3._4_4_] = puVar8[img_row_3._4_4_ + -2];
              }
              uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4),
                                  puVar8[img_row_3._4_4_ + -2]);
              puVar8[img_row_3._4_4_] = uVar6;
            }
            else {
LAB_001617cc:
              img_row_3._4_4_ = iVar5;
              if (puVar7[(img_row_3._4_4_ + -1) + lVar3] == '\0') {
                uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4),
                                    puVar8[img_row_3._4_4_ + -2]);
                puVar8[img_row_3._4_4_] = uVar6;
              }
              else {
                puVar8[img_row_3._4_4_] =
                     *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
              }
            }
          }
        }
        if ((int)(uStack_18 - 2) < iVar5) {
          if (puVar7[iVar5] == '\0') goto LAB_001625c5;
          if (puVar7[(img_row_3._4_4_ + 1) + lVar2] == '\0') goto LAB_00162270;
        }
        else {
          if (puVar7[iVar5] == '\0') {
            if (puVar7[iVar5 + lVar2] == '\0') goto LAB_00162b4f;
            if (puVar7[img_row_3._4_4_ + 3] == '\0') goto LAB_001625de;
          }
          if (puVar7[(img_row_3._4_4_ + 1) + lVar2] == '\0') goto LAB_00162aaf;
          if (puVar7[(img_row_3._4_4_ + 3) - lVar1] != '\0') goto LAB_00163768;
        }
        if (puVar7[iVar5 - lVar1] != '\0') goto LAB_001626f5;
        puVar8[iVar5] = puVar8[img_row_3._4_4_];
        goto LAB_00163b14;
      }
    }
    if (puVar7[(img_row_3._4_4_ + 4) - lVar1] != '\0') {
      if (puVar7[(img_row_3._4_4_ + 3) + lVar3] == '\0') {
        if (puVar7[iVar5 - lVar1] == '\0') {
          uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 4) * 4 + lVar4),
                              puVar8[img_row_3._4_4_]);
          puVar8[iVar5] = uVar6;
          img_row_3._4_4_ = iVar5;
        }
        else if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
          uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4),
                              *(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 4) * 4 + lVar4));
          uVar6 = UFPC::Merge(uVar6,puVar8[img_row_3._4_4_]);
          puVar8[iVar5] = uVar6;
          img_row_3._4_4_ = iVar5;
        }
        else {
LAB_001615d0:
          img_row_3._4_4_ = iVar5;
          if (puVar7[(img_row_3._4_4_ + -1) + lVar3] == '\0') {
            uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4),
                                *(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 2) * 4 + lVar4));
            uVar6 = UFPC::Merge(uVar6,puVar8[img_row_3._4_4_ + -2]);
            puVar8[img_row_3._4_4_] = uVar6;
          }
          else {
            uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 2) * 4 + lVar4),
                                puVar8[img_row_3._4_4_ + -2]);
            puVar8[img_row_3._4_4_] = uVar6;
          }
        }
      }
      else {
        if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
          uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 4) * 4 + lVar4),
                              puVar8[img_row_3._4_4_]);
          puVar8[iVar5] = uVar6;
          img_row_3._4_4_ = iVar5;
          goto LAB_00160605;
        }
LAB_00161549:
        img_row_3._4_4_ = iVar5;
        if (puVar7[(img_row_3._4_4_ + -1) + lVar3] != '\0') goto LAB_00160ab1;
        uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 2) * 4 + lVar4),
                            puVar8[img_row_3._4_4_ + -2]);
        puVar8[img_row_3._4_4_] = uVar6;
      }
      goto LAB_00160605;
    }
    if (puVar7[iVar5 - lVar1] == '\0') {
      puVar8[iVar5] = puVar8[img_row_3._4_4_];
      img_row_3._4_4_ = iVar5;
      goto LAB_0015fe18;
    }
    if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
      uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)iVar5 * 4 + lVar4),puVar8[img_row_3._4_4_])
      ;
      puVar8[iVar5] = uVar6;
      img_row_3._4_4_ = iVar5;
    }
    else {
LAB_001616fc:
      img_row_3._4_4_ = iVar5;
      if (puVar7[(img_row_3._4_4_ + -1) + lVar3] == '\0') {
        uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4),
                            puVar8[img_row_3._4_4_ + -2]);
        puVar8[img_row_3._4_4_] = uVar6;
      }
      else {
        puVar8[img_row_3._4_4_] = *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
      }
    }
    goto LAB_0016013c;
  }
LAB_001602b4:
  if (puVar7[(img_row_3._4_4_ + 4) - lVar1] == '\0') {
    puVar8[iVar5] = puVar8[img_row_3._4_4_];
    img_row_3._4_4_ = iVar5;
    goto LAB_00160eae;
  }
  if (puVar7[(img_row_3._4_4_ + 3) + lVar3] == '\0') {
    uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 4) * 4 + lVar4),
                        puVar8[img_row_3._4_4_]);
    puVar8[iVar5] = uVar6;
    img_row_3._4_4_ = iVar5;
  }
  else {
    if (puVar7[iVar5 + lVar3] != '\0') goto LAB_00160311;
    uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 4) * 4 + lVar4),
                        puVar8[img_row_3._4_4_]);
    puVar8[iVar5] = uVar6;
    img_row_3._4_4_ = iVar5;
  }
  goto LAB_00160605;
LAB_0015f5b0:
  img_row_3._4_4_ = iVar5;
  if (puVar7[(img_row_3._4_4_ + 1) - lVar1] != '\0') {
    if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
      if (puVar7[(img_row_3._4_4_ + -1) - lVar1] == '\0') {
        uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4),
                            puVar8[img_row_3._4_4_ + -2]);
        puVar8[img_row_3._4_4_] = uVar6;
      }
      else if (puVar7[img_row_3._4_4_ + lVar3] == '\0') {
        uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + -2) * 4 + lVar4),
                            *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4));
        uVar6 = UFPC::Merge(uVar6,puVar8[img_row_3._4_4_ + -2]);
        puVar8[img_row_3._4_4_] = uVar6;
      }
      else {
        uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4),
                            puVar8[img_row_3._4_4_ + -2]);
        puVar8[img_row_3._4_4_] = uVar6;
      }
    }
    else {
      uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4),
                          puVar8[img_row_3._4_4_ + -2]);
      puVar8[img_row_3._4_4_] = uVar6;
    }
    goto LAB_00161976;
  }
  if (puVar7[img_row_3._4_4_ + 1] != '\0') {
    if (puVar7[(img_row_3._4_4_ + 2) - lVar1] == '\0') {
      if (puVar7[(img_row_3._4_4_ + -1) - lVar1] == '\0') goto LAB_0015fa88;
      uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + -2) * 4 + lVar4),
                          puVar8[img_row_3._4_4_ + -2]);
      puVar8[img_row_3._4_4_] = uVar6;
      goto LAB_00160eae;
    }
    if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
      if (puVar7[(img_row_3._4_4_ + -1) - lVar1] == '\0') {
        uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 2) * 4 + lVar4),
                            puVar8[img_row_3._4_4_ + -2]);
        puVar8[img_row_3._4_4_] = uVar6;
      }
      else if (puVar7[(img_row_3._4_4_ + 1) + lVar3] == '\0') {
        uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + -2) * 4 + lVar4),
                            *(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 2) * 4 + lVar4));
        uVar6 = UFPC::Merge(uVar6,puVar8[img_row_3._4_4_ + -2]);
        puVar8[img_row_3._4_4_] = uVar6;
      }
      else if (puVar7[img_row_3._4_4_ + lVar3] == '\0') {
        uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + -2) * 4 + lVar4),
                            *(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 2) * 4 + lVar4));
        uVar6 = UFPC::Merge(uVar6,puVar8[img_row_3._4_4_ + -2]);
        puVar8[img_row_3._4_4_] = uVar6;
      }
      else {
        uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 2) * 4 + lVar4),
                            puVar8[img_row_3._4_4_ + -2]);
        puVar8[img_row_3._4_4_] = uVar6;
      }
    }
    else if (puVar7[(img_row_3._4_4_ + 1) + lVar3] == '\0') {
      uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4),
                          *(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 2) * 4 + lVar4));
      uVar6 = UFPC::Merge(uVar6,puVar8[img_row_3._4_4_ + -2]);
      puVar8[img_row_3._4_4_] = uVar6;
    }
    else {
      uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 2) * 4 + lVar4),
                          puVar8[img_row_3._4_4_ + -2]);
      puVar8[img_row_3._4_4_] = uVar6;
    }
    goto LAB_00160605;
  }
  if (puVar7[(img_row_3._4_4_ + -1) - lVar1] == '\0') goto LAB_0015fb76;
  uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + -2) * 4 + lVar4),
                      puVar8[img_row_3._4_4_ + -2]);
  puVar8[img_row_3._4_4_] = uVar6;
  goto LAB_00161d75;
LAB_0015f025:
  img_row_3._4_4_ = iVar5;
  if (puVar7[(img_row_3._4_4_ + 1) - lVar1] != '\0') {
    puVar8[img_row_3._4_4_] = *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
    goto LAB_00160919;
  }
LAB_0015ee3f:
  if (puVar7[(img_row_3._4_4_ + 2) - lVar1] != '\0') {
    if (puVar7[img_row_3._4_4_ - lVar1] != '\0') goto LAB_0015ee7c;
    puVar8[img_row_3._4_4_] = *(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 2) * 4 + lVar4);
    goto LAB_00160605;
  }
  if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
    uVar6 = UFPC::NewLabel();
    puVar8[img_row_3._4_4_] = uVar6;
    goto LAB_0015fe18;
  }
  puVar8[img_row_3._4_4_] = *(uint *)((long)puVar8 + (long)img_row_3._4_4_ * 4 + lVar4);
  goto LAB_0016013c;
LAB_00160a8f:
  img_row_3._4_4_ = iVar5;
  if (puVar7[(img_row_3._4_4_ + 1) + lVar3] == '\0') {
    uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 2) * 4 + lVar4),
                        puVar8[img_row_3._4_4_ + -2]);
    puVar8[img_row_3._4_4_] = uVar6;
  }
  else {
LAB_00160ab1:
    if (puVar7[img_row_3._4_4_ - lVar1] == '\0') {
      if (puVar7[img_row_3._4_4_ + lVar3] == '\0') {
        uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 2) * 4 + lVar4),
                            puVar8[img_row_3._4_4_ + -2]);
        puVar8[img_row_3._4_4_] = uVar6;
      }
      else {
        puVar8[img_row_3._4_4_] = *(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 2) * 4 + lVar4);
      }
    }
    else {
      puVar8[img_row_3._4_4_] = *(uint *)((long)puVar8 + (long)(img_row_3._4_4_ + 2) * 4 + lVar4);
    }
  }
  goto LAB_00160605;
LAB_001643de:
  if (puVar7[img_row_4._4_4_ + 3] == '\0') {
    puVar8[iVar5] = puVar8[img_row_4._4_4_];
    img_row_4._4_4_ = iVar5;
    goto LAB_00163bf6;
  }
  if (puVar7[(img_row_4._4_4_ + 4) - lVar1] != '\0') goto code_r0x0016441a;
  puVar8[iVar5] = puVar8[img_row_4._4_4_];
  img_row_4._4_4_ = iVar5;
  goto LAB_00165074;
code_r0x0016441a:
  uVar6 = UFPC::Merge(*(uint *)((long)puVar8 + (long)(img_row_4._4_4_ + 4) * 4 + lVar3),
                      puVar8[img_row_4._4_4_]);
  puVar8[iVar5] = uVar6;
  img_row_4._4_4_ = iVar5;
  goto LAB_001648ef;
}

Assistant:

void PerformLabeling()
	{
		const int h = img_.rows;
		const int w = img_.cols;

		int e_rows = h & 0xfffffffe;
		bool o_rows = h % 2 == 1;
		int e_cols = w & 0xfffffffe;
		bool o_cols = w % 2 == 1;

		img_labels_ = cv::Mat1i(img_.size()); // Memory allocation for the output image

		LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY); // Memory allocation of the labels solver
		LabelsSolver::Setup(); // Labels solver initialization

							   // We work with 2x2 blocks
							   // +-+-+-+
							   // |P|Q|R|
							   // +-+-+-+
							   // |S|X|
							   // +-+-+

							   // The pixels are named as follows
							   // +---+---+---+
							   // |a b|c d|e f|
							   // |g h|i j|k l|
							   // +---+---+---+
							   // |m n|o p|
							   // |q r|s t|
							   // +---+---+

							   // Pixels a, f, l, q are not needed, since we need to understand the
							   // the connectivity between these blocks and those pixels only matter
							   // when considering the outer connectivities

							   // A bunch of defines used to check if the pixels are foreground,
							   // without going outside the image limits.

							   // First scan

		// Define Conditions and Actions
		{
#define CONDITION_B img_row_prev_prev[c-1]>0
#define CONDITION_C img_row_prev_prev[c]>0
#define CONDITION_D img_row_prev_prev[c+1]>0
#define CONDITION_E img_row_prev_prev[c+2]>0

#define CONDITION_G img_row_prev[c-2]>0
#define CONDITION_H img_row_prev[c-1]>0
#define CONDITION_I img_row_prev[c]>0
#define CONDITION_J img_row_prev[c+1]>0
#define CONDITION_K img_row_prev[c+2]>0

#define CONDITION_M img_row[c-2]>0
#define CONDITION_N img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P img_row[c+1]>0

#define CONDITION_R img_row_fol[c-1]>0
#define CONDITION_S img_row_fol[c]>0
#define CONDITION_T img_row_fol[c+1]>0

			// Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; 
							   // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); 
							   //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2];
							   // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c];
							   // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2];
							   // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; 
							   // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]);
							   //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]);
							   // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]);
							   // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]);
							   // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]);
							   // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]);
							   // Action 13: Merge labels of block P, Q and R
#define ACTION_13 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row_prev_prev[c + 2]);
							   // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]);
							   //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
							   //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
		}

		if (h == 1) {
			// Single line
			// int r = 0;
			const unsigned char* const img_row = img_.ptr<unsigned char>(0);
			unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
			int c = -2;
#include "labeling_bolelli_2019_forest_sl.inc.h"
		}
		else {
			// More than one line

			// First couple of lines
			{
				// int r = 0;
				const unsigned char* const img_row = img_.ptr<unsigned char>(0);
				const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
				int c = -2;

#include "labeling_bolelli_2019_forest_fl.inc.h"
			}

			// Every other line but the last one if image has an odd number of rows
			for (int r = 2; r < e_rows; r += 2) {
				// Get rows pointer
				const unsigned char* const img_row = img_.ptr<unsigned char>(r);
				const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
				const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
				const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
				unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

				int c = -2;
				goto tree_0;

#include "labeling_bolelli_2019_forest.inc.h"
			}

			// Last line (in case the rows are odd)
			if (o_rows)
			{
				int r = h - 1;
				const unsigned char* const img_row = img_.ptr<unsigned char>(r);
				const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
				const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
				unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);
				int c = -2;
#include "labeling_bolelli_2019_forest_ll.inc.h"
			}
		}


		// Undef Conditions and Actions
		{
#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
		}

		// Second scan
		n_labels_ = LabelsSolver::Flatten();

		int r = 0;
		for (; r < e_rows; r += 2) {
			// Get rows pointer
			const unsigned char* const img_row = img_.ptr<unsigned char>(r);
			const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);

			unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
			unsigned* const img_labels_row_fol = (unsigned*)(((char*)img_labels_row) + img_labels_.step.p[0]);
			int c = 0;
			for (; c < e_cols; c += 2) {
				int iLabel = img_labels_row[c];
				if (iLabel > 0) {
					iLabel = LabelsSolver::GetLabel(iLabel);
					if (img_row[c] > 0)
						img_labels_row[c] = iLabel;
					else
						img_labels_row[c] = 0;
					if (img_row[c + 1] > 0)
						img_labels_row[c + 1] = iLabel;
					else
						img_labels_row[c + 1] = 0;
					if (img_row_fol[c] > 0)
						img_labels_row_fol[c] = iLabel;
					else
						img_labels_row_fol[c] = 0;
					if (img_row_fol[c + 1] > 0)
						img_labels_row_fol[c + 1] = iLabel;
					else
						img_labels_row_fol[c + 1] = 0;
				}
				else {
					img_labels_row[c] = 0;
					img_labels_row[c + 1] = 0;
					img_labels_row_fol[c] = 0;
					img_labels_row_fol[c + 1] = 0;
				}
			}
			// Last column if the number of columns is odd
			if (o_cols) {
				int iLabel = img_labels_row[c];
				if (iLabel > 0) {
					iLabel = LabelsSolver::GetLabel(iLabel);
					if (img_row[c] > 0)
						img_labels_row[c] = iLabel;
					else
						img_labels_row[c] = 0;
					if (img_row_fol[c] > 0)
						img_labels_row_fol[c] = iLabel;
					else
						img_labels_row_fol[c] = 0;
				}
				else {
					img_labels_row[c] = 0;
					img_labels_row_fol[c] = 0;
				}
			}
		}
		// Last row if the number of rows is odd
		if (o_rows) {
			// Get rows pointer
			const unsigned char* const img_row = img_.ptr<unsigned char>(r);
			unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
			int c = 0;
			for (; c < e_cols; c += 2) {
				int iLabel = img_labels_row[c];
				if (iLabel > 0) {
					iLabel = LabelsSolver::GetLabel(iLabel);
					if (img_row[c] > 0)
						img_labels_row[c] = iLabel;
					else
						img_labels_row[c] = 0;
					if (img_row[c + 1] > 0)
						img_labels_row[c + 1] = iLabel;
					else
						img_labels_row[c + 1] = 0;
				}
				else {
					img_labels_row[c] = 0;
					img_labels_row[c + 1] = 0;
				}
			}
			// Last column if the number of columns is odd
			if (o_cols) {
				int iLabel = img_labels_row[c];
				if (iLabel > 0) {
					iLabel = LabelsSolver::GetLabel(iLabel);
					if (img_row[c] > 0)
						img_labels_row[c] = iLabel;
					else
						img_labels_row[c] = 0;
				}
				else {
					img_labels_row[c] = 0;
				}
			}
		}

		LabelsSolver::Dealloc();

	}